

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined8 uVar35;
  ulong uVar36;
  long lVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  undefined1 auVar79 [32];
  float fVar80;
  Geometry *pGVar81;
  byte bVar82;
  ulong uVar83;
  uint uVar84;
  uint uVar85;
  long lVar86;
  long lVar87;
  Geometry *pGVar88;
  uint uVar89;
  ulong uVar90;
  byte bVar91;
  ulong uVar92;
  float fVar93;
  float fVar94;
  float fVar148;
  float fVar150;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar149;
  float fVar151;
  float fVar153;
  float fVar154;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar106 [16];
  float fVar152;
  float fVar155;
  float fVar156;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [64];
  undefined4 uVar157;
  float fVar174;
  float fVar175;
  vint4 bi_2;
  float fVar176;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  float fVar177;
  undefined8 uVar178;
  vint4 bi_1;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  float fVar184;
  float fVar185;
  float fVar197;
  vint4 bi;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  vint4 ai_2;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [64];
  vint4 ai_1;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [64];
  vint4 ai;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [64];
  float fVar229;
  float fVar230;
  undefined1 auVar228 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar240 [32];
  undefined1 auVar244 [64];
  undefined1 auVar245 [16];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  RTCFilterFunctionNArguments local_848;
  Geometry *local_818;
  undefined1 (*local_810) [32];
  LinearSpace3fa *local_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined4 local_7a0;
  undefined4 uStack_79c;
  undefined4 uStack_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  undefined4 uStack_788;
  undefined4 uStack_784;
  undefined1 local_780 [64];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined4 uStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined4 local_5e0;
  int local_5dc;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  float local_580 [4];
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 auVar241 [32];
  
  PVar6 = prim[1];
  uVar83 = (ulong)(byte)PVar6;
  lVar37 = uVar83 * 0x25;
  fVar185 = *(float *)(prim + lVar37 + 0x12);
  auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar95 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar95 = vsubps_avx(auVar95,*(undefined1 (*) [16])(prim + lVar37 + 6));
  auVar198._0_4_ = fVar185 * auVar95._0_4_;
  auVar198._4_4_ = fVar185 * auVar95._4_4_;
  auVar198._8_4_ = fVar185 * auVar95._8_4_;
  auVar198._12_4_ = fVar185 * auVar95._12_4_;
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 6)));
  auVar106._0_4_ = fVar185 * auVar96._0_4_;
  auVar106._4_4_ = fVar185 * auVar96._4_4_;
  auVar106._8_4_ = fVar185 * auVar96._8_4_;
  auVar106._12_4_ = fVar185 * auVar96._12_4_;
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 5 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 6)));
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xf + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar83 + 6)));
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1a + 6)));
  auVar31 = vcvtdq2ps_avx(auVar31);
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1b + 6)));
  auVar32 = vcvtdq2ps_avx(auVar32);
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1c + 6)));
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar215._4_4_ = auVar106._0_4_;
  auVar215._0_4_ = auVar106._0_4_;
  auVar215._8_4_ = auVar106._0_4_;
  auVar215._12_4_ = auVar106._0_4_;
  auVar34 = vshufps_avx(auVar106,auVar106,0x55);
  auVar100 = vshufps_avx(auVar106,auVar106,0xaa);
  fVar185 = auVar100._0_4_;
  auVar186._0_4_ = fVar185 * auVar104._0_4_;
  fVar174 = auVar100._4_4_;
  auVar186._4_4_ = fVar174 * auVar104._4_4_;
  fVar175 = auVar100._8_4_;
  auVar186._8_4_ = fVar175 * auVar104._8_4_;
  fVar176 = auVar100._12_4_;
  auVar186._12_4_ = fVar176 * auVar104._12_4_;
  auVar179._0_4_ = auVar30._0_4_ * fVar185;
  auVar179._4_4_ = auVar30._4_4_ * fVar174;
  auVar179._8_4_ = auVar30._8_4_ * fVar175;
  auVar179._12_4_ = auVar30._12_4_ * fVar176;
  auVar158._0_4_ = auVar33._0_4_ * fVar185;
  auVar158._4_4_ = auVar33._4_4_ * fVar174;
  auVar158._8_4_ = auVar33._8_4_ * fVar175;
  auVar158._12_4_ = auVar33._12_4_ * fVar176;
  auVar100 = vfmadd231ps_fma(auVar186,auVar34,auVar96);
  auVar101 = vfmadd231ps_fma(auVar179,auVar34,auVar29);
  auVar34 = vfmadd231ps_fma(auVar158,auVar32,auVar34);
  auVar102 = vfmadd231ps_fma(auVar100,auVar215,auVar95);
  auVar101 = vfmadd231ps_fma(auVar101,auVar215,auVar28);
  auVar103 = vfmadd231ps_fma(auVar34,auVar31,auVar215);
  auVar238._4_4_ = auVar198._0_4_;
  auVar238._0_4_ = auVar198._0_4_;
  auVar238._8_4_ = auVar198._0_4_;
  auVar238._12_4_ = auVar198._0_4_;
  auVar34 = vshufps_avx(auVar198,auVar198,0x55);
  auVar100 = vshufps_avx(auVar198,auVar198,0xaa);
  fVar185 = auVar100._0_4_;
  auVar216._0_4_ = fVar185 * auVar104._0_4_;
  fVar174 = auVar100._4_4_;
  auVar216._4_4_ = fVar174 * auVar104._4_4_;
  fVar175 = auVar100._8_4_;
  auVar216._8_4_ = fVar175 * auVar104._8_4_;
  fVar176 = auVar100._12_4_;
  auVar216._12_4_ = fVar176 * auVar104._12_4_;
  auVar208._0_4_ = auVar30._0_4_ * fVar185;
  auVar208._4_4_ = auVar30._4_4_ * fVar174;
  auVar208._8_4_ = auVar30._8_4_ * fVar175;
  auVar208._12_4_ = auVar30._12_4_ * fVar176;
  auVar199._0_4_ = auVar33._0_4_ * fVar185;
  auVar199._4_4_ = auVar33._4_4_ * fVar174;
  auVar199._8_4_ = auVar33._8_4_ * fVar175;
  auVar199._12_4_ = auVar33._12_4_ * fVar176;
  auVar96 = vfmadd231ps_fma(auVar216,auVar34,auVar96);
  auVar104 = vfmadd231ps_fma(auVar208,auVar34,auVar29);
  auVar29 = vfmadd231ps_fma(auVar199,auVar34,auVar32);
  auVar105 = vfmadd231ps_fma(auVar96,auVar238,auVar95);
  auVar106 = vfmadd231ps_fma(auVar104,auVar238,auVar28);
  auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar246 = ZEXT1664(auVar95);
  auVar158 = vfmadd231ps_fma(auVar29,auVar238,auVar31);
  auVar96 = vandps_avx512vl(auVar102,auVar95);
  auVar225._8_4_ = 0x219392ef;
  auVar225._0_8_ = 0x219392ef219392ef;
  auVar225._12_4_ = 0x219392ef;
  uVar90 = vcmpps_avx512vl(auVar96,auVar225,1);
  bVar14 = (bool)((byte)uVar90 & 1);
  auVar97._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar102._0_4_;
  bVar14 = (bool)((byte)(uVar90 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar102._4_4_;
  bVar14 = (bool)((byte)(uVar90 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar102._8_4_;
  bVar14 = (bool)((byte)(uVar90 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar102._12_4_;
  auVar96 = vandps_avx512vl(auVar101,auVar95);
  uVar90 = vcmpps_avx512vl(auVar96,auVar225,1);
  bVar14 = (bool)((byte)uVar90 & 1);
  auVar98._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar101._0_4_;
  bVar14 = (bool)((byte)(uVar90 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar101._4_4_;
  bVar14 = (bool)((byte)(uVar90 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar101._8_4_;
  bVar14 = (bool)((byte)(uVar90 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar101._12_4_;
  auVar95 = vandps_avx512vl(auVar103,auVar95);
  uVar90 = vcmpps_avx512vl(auVar95,auVar225,1);
  bVar14 = (bool)((byte)uVar90 & 1);
  auVar99._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar103._0_4_;
  bVar14 = (bool)((byte)(uVar90 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar103._4_4_;
  bVar14 = (bool)((byte)(uVar90 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar103._8_4_;
  bVar14 = (bool)((byte)(uVar90 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar103._12_4_;
  auVar96 = vrcp14ps_avx512vl(auVar97);
  auVar226._8_4_ = 0x3f800000;
  auVar226._0_8_ = 0x3f8000003f800000;
  auVar226._12_4_ = 0x3f800000;
  auVar95 = vfnmadd213ps_fma(auVar97,auVar96,auVar226);
  auVar102 = vfmadd132ps_fma(auVar95,auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar98);
  auVar95 = vfnmadd213ps_fma(auVar98,auVar96,auVar226);
  auVar103 = vfmadd132ps_fma(auVar95,auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar99);
  auVar95 = vfnmadd213ps_fma(auVar99,auVar96,auVar226);
  auVar245 = vfmadd132ps_fma(auVar95,auVar96,auVar96);
  fVar185 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar37 + 0x16)) *
            *(float *)(prim + lVar37 + 0x1a);
  auVar223._4_4_ = fVar185;
  auVar223._0_4_ = fVar185;
  auVar223._8_4_ = fVar185;
  auVar223._12_4_ = fVar185;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar83 * 7 + 6);
  auVar95 = vpmovsxwd_avx(auVar95);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar83 * 0xb + 6);
  auVar96 = vpmovsxwd_avx(auVar96);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar28 = vsubps_avx(auVar96,auVar95);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar83 * 9 + 6);
  auVar96 = vpmovsxwd_avx(auVar104);
  auVar104 = vfmadd213ps_fma(auVar28,auVar223,auVar95);
  auVar95 = vcvtdq2ps_avx(auVar96);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar83 * 0xd + 6);
  auVar96 = vpmovsxwd_avx(auVar28);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar95);
  auVar28 = vfmadd213ps_fma(auVar96,auVar223,auVar95);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar83 * 0x12 + 6);
  auVar95 = vpmovsxwd_avx(auVar29);
  auVar95 = vcvtdq2ps_avx(auVar95);
  uVar90 = (ulong)(uint)((int)(uVar83 * 5) << 2);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar83 * 2 + uVar90 + 6);
  auVar96 = vpmovsxwd_avx(auVar30);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar95);
  auVar29 = vfmadd213ps_fma(auVar96,auVar223,auVar95);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar90 + 6);
  auVar95 = vpmovsxwd_avx(auVar31);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar83 * 0x18 + 6);
  auVar96 = vpmovsxwd_avx(auVar32);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar95);
  auVar30 = vfmadd213ps_fma(auVar96,auVar223,auVar95);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar83 * 0x1d + 6);
  auVar95 = vpmovsxwd_avx(auVar33);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar83 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar96 = vpmovsxwd_avx(auVar34);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar95);
  auVar31 = vfmadd213ps_fma(auVar96,auVar223,auVar95);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar83) + 6);
  auVar95 = vpmovsxwd_avx(auVar100);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar83 * 0x23 + 6);
  auVar96 = vpmovsxwd_avx(auVar101);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar95);
  auVar96 = vfmadd213ps_fma(auVar96,auVar223,auVar95);
  auVar95 = vsubps_avx(auVar104,auVar105);
  auVar224._0_4_ = auVar102._0_4_ * auVar95._0_4_;
  auVar224._4_4_ = auVar102._4_4_ * auVar95._4_4_;
  auVar224._8_4_ = auVar102._8_4_ * auVar95._8_4_;
  auVar224._12_4_ = auVar102._12_4_ * auVar95._12_4_;
  auVar95 = vsubps_avx(auVar28,auVar105);
  auVar187._0_4_ = auVar102._0_4_ * auVar95._0_4_;
  auVar187._4_4_ = auVar102._4_4_ * auVar95._4_4_;
  auVar187._8_4_ = auVar102._8_4_ * auVar95._8_4_;
  auVar187._12_4_ = auVar102._12_4_ * auVar95._12_4_;
  auVar95 = vsubps_avx(auVar29,auVar106);
  auVar217._0_4_ = auVar103._0_4_ * auVar95._0_4_;
  auVar217._4_4_ = auVar103._4_4_ * auVar95._4_4_;
  auVar217._8_4_ = auVar103._8_4_ * auVar95._8_4_;
  auVar217._12_4_ = auVar103._12_4_ * auVar95._12_4_;
  auVar95 = vsubps_avx(auVar30,auVar106);
  auVar180._0_4_ = auVar103._0_4_ * auVar95._0_4_;
  auVar180._4_4_ = auVar103._4_4_ * auVar95._4_4_;
  auVar180._8_4_ = auVar103._8_4_ * auVar95._8_4_;
  auVar180._12_4_ = auVar103._12_4_ * auVar95._12_4_;
  auVar95 = vsubps_avx(auVar31,auVar158);
  auVar209._0_4_ = auVar245._0_4_ * auVar95._0_4_;
  auVar209._4_4_ = auVar245._4_4_ * auVar95._4_4_;
  auVar209._8_4_ = auVar245._8_4_ * auVar95._8_4_;
  auVar209._12_4_ = auVar245._12_4_ * auVar95._12_4_;
  auVar95 = vsubps_avx(auVar96,auVar158);
  auVar159._0_4_ = auVar245._0_4_ * auVar95._0_4_;
  auVar159._4_4_ = auVar245._4_4_ * auVar95._4_4_;
  auVar159._8_4_ = auVar245._8_4_ * auVar95._8_4_;
  auVar159._12_4_ = auVar245._12_4_ * auVar95._12_4_;
  auVar95 = vpminsd_avx(auVar224,auVar187);
  auVar96 = vpminsd_avx(auVar217,auVar180);
  auVar95 = vmaxps_avx(auVar95,auVar96);
  auVar96 = vpminsd_avx(auVar209,auVar159);
  uVar157 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar102._4_4_ = uVar157;
  auVar102._0_4_ = uVar157;
  auVar102._8_4_ = uVar157;
  auVar102._12_4_ = uVar157;
  auVar96 = vmaxps_avx512vl(auVar96,auVar102);
  auVar95 = vmaxps_avx(auVar95,auVar96);
  auVar103._8_4_ = 0x3f7ffffa;
  auVar103._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar103._12_4_ = 0x3f7ffffa;
  local_510 = vmulps_avx512vl(auVar95,auVar103);
  auVar95 = vpmaxsd_avx(auVar224,auVar187);
  auVar96 = vpmaxsd_avx(auVar217,auVar180);
  auVar95 = vminps_avx(auVar95,auVar96);
  auVar96 = vpmaxsd_avx(auVar209,auVar159);
  uVar157 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar245._4_4_ = uVar157;
  auVar245._0_4_ = uVar157;
  auVar245._8_4_ = uVar157;
  auVar245._12_4_ = uVar157;
  auVar96 = vminps_avx512vl(auVar96,auVar245);
  auVar95 = vminps_avx(auVar95,auVar96);
  auVar105._8_4_ = 0x3f800003;
  auVar105._0_8_ = 0x3f8000033f800003;
  auVar105._12_4_ = 0x3f800003;
  auVar95 = vmulps_avx512vl(auVar95,auVar105);
  auVar96 = vpbroadcastd_avx512vl();
  uVar178 = vcmpps_avx512vl(local_510,auVar95,2);
  uVar90 = vpcmpgtd_avx512vl(auVar96,_DAT_01f7fcf0);
  uVar90 = ((byte)uVar178 & 0xf) & uVar90;
  if ((char)uVar90 != '\0') {
    local_808 = pre->ray_space + k;
    local_810 = (undefined1 (*) [32])local_100;
    auVar247 = ZEXT464(0xbf800000);
    auVar173 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar173);
    auVar95 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
    auVar173 = ZEXT1664(auVar95);
    do {
      lVar37 = 0;
      for (uVar83 = uVar90; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
        lVar37 = lVar37 + 1;
      }
      uVar89 = *(uint *)(prim + 2);
      uVar7 = *(uint *)(prim + lVar37 * 4 + 6);
      pGVar88 = (context->scene->geometries).items[uVar89].ptr;
      uVar83 = (ulong)*(uint *)(*(long *)&pGVar88->field_0x58 +
                               (ulong)uVar7 *
                               pGVar88[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar185 = (pGVar88->time_range).lower;
      fVar185 = pGVar88->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x1c0) - fVar185) /
                ((pGVar88->time_range).upper - fVar185));
      auVar95 = vroundss_avx(ZEXT416((uint)fVar185),ZEXT416((uint)fVar185),9);
      auVar96 = vaddss_avx512f(ZEXT416((uint)pGVar88->fnumTimeSegments),auVar247._0_16_);
      auVar95 = vminss_avx(auVar95,auVar96);
      auVar95 = vmaxss_avx(ZEXT816(0) << 0x20,auVar95);
      fVar185 = fVar185 - auVar95._0_4_;
      fVar174 = 1.0 - fVar185;
      _Var10 = pGVar88[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar86 = (long)(int)auVar95._0_4_ * 0x38;
      lVar87 = *(long *)(_Var10 + 0x10 + lVar86);
      lVar11 = *(long *)(_Var10 + 0x38 + lVar86);
      lVar12 = *(long *)(_Var10 + 0x48 + lVar86);
      auVar160._4_4_ = fVar185;
      auVar160._0_4_ = fVar185;
      auVar160._8_4_ = fVar185;
      auVar160._12_4_ = fVar185;
      pfVar3 = (float *)(lVar11 + lVar12 * uVar83);
      auVar228._0_4_ = fVar185 * *pfVar3;
      auVar228._4_4_ = fVar185 * pfVar3[1];
      auVar228._8_4_ = fVar185 * pfVar3[2];
      auVar228._12_4_ = fVar185 * pfVar3[3];
      lVar37 = uVar83 + 1;
      auVar95 = vmulps_avx512vl(auVar160,*(undefined1 (*) [16])(lVar11 + lVar12 * lVar37));
      p_Var13 = pGVar88[4].occlusionFilterN;
      auVar181._4_4_ = fVar174;
      auVar181._0_4_ = fVar174;
      auVar181._8_4_ = fVar174;
      auVar181._12_4_ = fVar174;
      auVar28 = vfmadd231ps_fma(auVar228,auVar181,
                                *(undefined1 (*) [16])(*(long *)(_Var10 + lVar86) + lVar87 * uVar83)
                               );
      auVar100 = vfmadd231ps_avx512vl
                           (auVar95,auVar181,
                            *(undefined1 (*) [16])(*(long *)(_Var10 + lVar86) + lVar87 * lVar37));
      pfVar3 = (float *)(*(long *)(p_Var13 + lVar86 + 0x38) +
                        uVar83 * *(long *)(p_Var13 + lVar86 + 0x48));
      auVar231._0_4_ = fVar185 * *pfVar3;
      auVar231._4_4_ = fVar185 * pfVar3[1];
      auVar231._8_4_ = fVar185 * pfVar3[2];
      auVar231._12_4_ = fVar185 * pfVar3[3];
      pfVar3 = (float *)(*(long *)(p_Var13 + lVar86 + 0x38) +
                        *(long *)(p_Var13 + lVar86 + 0x48) * lVar37);
      auVar235._0_4_ = fVar185 * *pfVar3;
      auVar235._4_4_ = fVar185 * pfVar3[1];
      auVar235._8_4_ = fVar185 * pfVar3[2];
      auVar235._12_4_ = fVar185 * pfVar3[3];
      auVar96 = vfmadd231ps_fma(auVar231,auVar181,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var13 + lVar86) +
                                 *(long *)(p_Var13 + lVar86 + 0x10) * uVar83));
      auVar104 = vfmadd231ps_fma(auVar235,auVar181,
                                 *(undefined1 (*) [16])
                                  (*(long *)(p_Var13 + lVar86) +
                                  *(long *)(p_Var13 + lVar86 + 0x10) * lVar37));
      iVar8 = (int)pGVar88[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40))
                              ,0x1c);
      auVar95 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      lVar37 = (long)iVar8 * 0x44;
      auVar101 = vfnmadd213ps_avx512vl(auVar96,auVar173._0_16_,auVar28);
      auVar102 = vfmadd213ps_avx512vl(auVar104,auVar173._0_16_,auVar100);
      auVar104 = vsubps_avx(auVar28,auVar95);
      uVar157 = auVar104._0_4_;
      auVar188._4_4_ = uVar157;
      auVar188._0_4_ = uVar157;
      auVar188._8_4_ = uVar157;
      auVar188._12_4_ = uVar157;
      auVar96 = vshufps_avx(auVar104,auVar104,0x55);
      aVar4 = (local_808->vx).field_0;
      aVar5 = (local_808->vy).field_0;
      fVar185 = (local_808->vz).field_0.m128[0];
      fVar174 = *(float *)((long)&(local_808->vz).field_0 + 4);
      fVar175 = *(float *)((long)&(local_808->vz).field_0 + 8);
      fVar176 = *(float *)((long)&(local_808->vz).field_0 + 0xc);
      auVar104 = vshufps_avx(auVar104,auVar104,0xaa);
      auVar234._0_4_ = fVar185 * auVar104._0_4_;
      auVar234._4_4_ = fVar174 * auVar104._4_4_;
      auVar234._8_4_ = fVar175 * auVar104._8_4_;
      auVar234._12_4_ = fVar176 * auVar104._12_4_;
      auVar96 = vfmadd231ps_fma(auVar234,(undefined1  [16])aVar5,auVar96);
      auVar29 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar4,auVar188);
      auVar104 = vsubps_avx(auVar101,auVar95);
      uVar157 = auVar104._0_4_;
      auVar189._4_4_ = uVar157;
      auVar189._0_4_ = uVar157;
      auVar189._8_4_ = uVar157;
      auVar189._12_4_ = uVar157;
      auVar96 = vshufps_avx(auVar104,auVar104,0x55);
      auVar104 = vshufps_avx(auVar104,auVar104,0xaa);
      auVar236._0_4_ = fVar185 * auVar104._0_4_;
      auVar236._4_4_ = fVar174 * auVar104._4_4_;
      auVar236._8_4_ = fVar175 * auVar104._8_4_;
      auVar236._12_4_ = fVar176 * auVar104._12_4_;
      auVar96 = vfmadd231ps_fma(auVar236,(undefined1  [16])aVar5,auVar96);
      auVar30 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar4,auVar189);
      auVar104 = vsubps_avx(auVar102,auVar95);
      uVar157 = auVar104._0_4_;
      auVar190._4_4_ = uVar157;
      auVar190._0_4_ = uVar157;
      auVar190._8_4_ = uVar157;
      auVar190._12_4_ = uVar157;
      auVar96 = vshufps_avx(auVar104,auVar104,0x55);
      auVar104 = vshufps_avx(auVar104,auVar104,0xaa);
      auVar237._0_4_ = fVar185 * auVar104._0_4_;
      auVar237._4_4_ = fVar174 * auVar104._4_4_;
      auVar237._8_4_ = fVar175 * auVar104._8_4_;
      auVar237._12_4_ = fVar176 * auVar104._12_4_;
      auVar96 = vfmadd231ps_fma(auVar237,(undefined1  [16])aVar5,auVar96);
      auVar104 = vfmadd231ps_fma(auVar96,(undefined1  [16])aVar4,auVar190);
      auVar96 = vsubps_avx512vl(auVar100,auVar95);
      uVar157 = auVar96._0_4_;
      auVar182._4_4_ = uVar157;
      auVar182._0_4_ = uVar157;
      auVar182._8_4_ = uVar157;
      auVar182._12_4_ = uVar157;
      auVar95 = vshufps_avx(auVar96,auVar96,0x55);
      auVar96 = vshufps_avx(auVar96,auVar96,0xaa);
      auVar239._0_4_ = fVar185 * auVar96._0_4_;
      auVar239._4_4_ = fVar174 * auVar96._4_4_;
      auVar239._8_4_ = fVar175 * auVar96._8_4_;
      auVar239._12_4_ = fVar176 * auVar96._12_4_;
      auVar95 = vfmadd231ps_fma(auVar239,(undefined1  [16])aVar5,auVar95);
      auVar31 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar182);
      auVar121 = *(undefined1 (*) [32])(bezier_basis0 + lVar37);
      uVar157 = auVar29._0_4_;
      local_660._4_4_ = uVar157;
      local_660._0_4_ = uVar157;
      local_660._8_4_ = uVar157;
      local_660._12_4_ = uVar157;
      local_660._16_4_ = uVar157;
      local_660._20_4_ = uVar157;
      local_660._24_4_ = uVar157;
      local_660._28_4_ = uVar157;
      auVar122 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x484);
      auVar107._8_4_ = 1;
      auVar107._0_8_ = 0x100000001;
      auVar107._12_4_ = 1;
      auVar107._16_4_ = 1;
      auVar107._20_4_ = 1;
      auVar107._24_4_ = 1;
      auVar107._28_4_ = 1;
      local_680 = vpermps_avx2(auVar107,ZEXT1632(auVar29));
      uVar157 = auVar30._0_4_;
      auVar200._4_4_ = uVar157;
      auVar200._0_4_ = uVar157;
      auVar200._8_4_ = uVar157;
      auVar200._12_4_ = uVar157;
      local_6a0._16_4_ = uVar157;
      local_6a0._0_16_ = auVar200;
      local_6a0._20_4_ = uVar157;
      local_6a0._24_4_ = uVar157;
      local_6a0._28_4_ = uVar157;
      local_6c0 = vpermps_avx512vl(auVar107,ZEXT1632(auVar30));
      auVar120 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x908);
      local_6e0 = vbroadcastss_avx512vl(auVar104);
      local_700 = vpermps_avx512vl(auVar107,ZEXT1632(auVar104));
      auVar119 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0xd8c);
      uVar157 = auVar31._0_4_;
      local_720._4_4_ = uVar157;
      local_720._0_4_ = uVar157;
      fStack_718 = (float)uVar157;
      fStack_714 = (float)uVar157;
      fStack_710 = (float)uVar157;
      fStack_70c = (float)uVar157;
      fStack_708 = (float)uVar157;
      register0x0000139c = uVar157;
      _local_740 = vpermps_avx512vl(auVar107,ZEXT1632(auVar31));
      auVar107 = vmulps_avx512vl(_local_720,auVar119);
      auVar108 = vmulps_avx512vl(_local_740,auVar119);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar120,local_6e0);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar120,local_700);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar122,local_6a0);
      auVar109 = vfmadd231ps_avx512vl(auVar108,auVar122,local_6c0);
      auVar110 = vfmadd231ps_avx512vl(auVar107,auVar121,local_660);
      auVar222 = ZEXT3264(auVar110);
      auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar37);
      auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x484);
      auVar118 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x908);
      auVar111 = vfmadd231ps_avx512vl(auVar109,auVar121,local_680);
      auVar214 = ZEXT3264(auVar111);
      auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0xd8c);
      auVar112 = vmulps_avx512vl(_local_720,auVar109);
      auVar113 = vmulps_avx512vl(_local_740,auVar109);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar118,local_6e0);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar118,local_700);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,local_6a0);
      auVar113 = vfmadd231ps_avx512vl(auVar113,auVar108,local_6c0);
      auVar32 = vfmadd231ps_fma(auVar112,auVar107,local_660);
      auVar227 = ZEXT1664(auVar32);
      auVar33 = vfmadd231ps_fma(auVar113,auVar107,local_680);
      auVar112 = vsubps_avx512vl(ZEXT1632(auVar32),auVar110);
      auVar113 = vsubps_avx512vl(ZEXT1632(auVar33),auVar111);
      auVar114 = vmulps_avx512vl(auVar111,auVar112);
      auVar115 = vmulps_avx512vl(auVar110,auVar113);
      auVar114 = vsubps_avx512vl(auVar114,auVar115);
      auVar95 = vshufps_avx(auVar28,auVar28,0xff);
      uVar178 = auVar95._0_8_;
      local_320._8_8_ = uVar178;
      local_320._0_8_ = uVar178;
      local_320._16_8_ = uVar178;
      local_320._24_8_ = uVar178;
      auVar95 = vshufps_avx(auVar101,auVar101,0xff);
      local_340 = vbroadcastsd_avx512vl(auVar95);
      auVar95 = vshufps_avx(auVar102,auVar102,0xff);
      local_360 = vbroadcastsd_avx512vl(auVar95);
      auVar95 = vshufps_avx512vl(auVar100,auVar100,0xff);
      uVar178 = auVar95._0_8_;
      local_380._8_8_ = uVar178;
      local_380._0_8_ = uVar178;
      local_380._16_8_ = uVar178;
      local_380._24_8_ = uVar178;
      auVar115 = vmulps_avx512vl(local_380,auVar119);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar120,local_360);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar122,local_340);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar121,local_320);
      auVar116 = vmulps_avx512vl(local_380,auVar109);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar118,local_360);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar108,local_340);
      auVar34 = vfmadd231ps_fma(auVar116,auVar107,local_320);
      auVar116 = vmulps_avx512vl(auVar113,auVar113);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar112,auVar112);
      auVar117 = vmaxps_avx512vl(auVar115,ZEXT1632(auVar34));
      auVar117 = vmulps_avx512vl(auVar117,auVar117);
      auVar116 = vmulps_avx512vl(auVar117,auVar116);
      auVar114 = vmulps_avx512vl(auVar114,auVar114);
      uVar178 = vcmpps_avx512vl(auVar114,auVar116,2);
      auVar95 = vblendps_avx(auVar29,auVar28,8);
      auVar245 = auVar246._0_16_;
      auVar96 = vandps_avx512vl(auVar95,auVar245);
      auVar95 = vblendps_avx(auVar30,auVar101,8);
      auVar95 = vandps_avx512vl(auVar95,auVar245);
      auVar96 = vmaxps_avx(auVar96,auVar95);
      auVar95 = vblendps_avx(auVar104,auVar102,8);
      auVar103 = vandps_avx512vl(auVar95,auVar245);
      auVar95 = vblendps_avx(auVar31,auVar100,8);
      auVar95 = vandps_avx512vl(auVar95,auVar245);
      auVar95 = vmaxps_avx(auVar103,auVar95);
      auVar95 = vmaxps_avx(auVar96,auVar95);
      auVar96 = vmovshdup_avx(auVar95);
      auVar96 = vmaxss_avx(auVar96,auVar95);
      auVar95 = vshufpd_avx(auVar95,auVar95,1);
      auVar95 = vmaxss_avx(auVar95,auVar96);
      auVar96 = vcvtsi2ss_avx512f(auVar245,iVar8);
      local_480._0_16_ = auVar96;
      auVar116._0_4_ = auVar96._0_4_;
      auVar116._4_4_ = auVar116._0_4_;
      auVar116._8_4_ = auVar116._0_4_;
      auVar116._12_4_ = auVar116._0_4_;
      auVar116._16_4_ = auVar116._0_4_;
      auVar116._20_4_ = auVar116._0_4_;
      auVar116._24_4_ = auVar116._0_4_;
      auVar116._28_4_ = auVar116._0_4_;
      uVar35 = vcmpps_avx512vl(auVar116,_DAT_01faff40,0xe);
      bVar91 = (byte)uVar178 & (byte)uVar35;
      fVar185 = auVar95._0_4_ * 4.7683716e-07;
      local_7e0._0_16_ = ZEXT416((uint)fVar185);
      auVar114._8_4_ = 2;
      auVar114._0_8_ = 0x200000002;
      auVar114._12_4_ = 2;
      auVar114._16_4_ = 2;
      auVar114._20_4_ = 2;
      auVar114._24_4_ = 2;
      auVar114._28_4_ = 2;
      local_4a0 = vpermps_avx2(auVar114,ZEXT1632(auVar29));
      local_4c0 = vpermps_avx2(auVar114,ZEXT1632(auVar30));
      local_4e0 = vpermps_avx2(auVar114,ZEXT1632(auVar104));
      local_500 = vpermps_avx2(auVar114,ZEXT1632(auVar31));
      local_7a0 = *(undefined4 *)(ray + k * 4 + 0xc0);
      uStack_79c = 0;
      uStack_798 = 0;
      uStack_794 = 0;
      local_860 = auVar28._0_8_;
      uStack_858 = auVar28._8_8_;
      local_880 = auVar101._0_8_;
      uStack_878 = auVar101._8_8_;
      local_890 = auVar102._0_8_;
      uStack_888 = auVar102._8_8_;
      local_870._0_4_ = auVar100._0_4_;
      fVar174 = (float)local_870;
      local_870._4_4_ = auVar100._4_4_;
      fVar175 = local_870._4_4_;
      uStack_868._0_4_ = auVar100._8_4_;
      fVar176 = (float)uStack_868;
      uStack_868._4_4_ = auVar100._12_4_;
      fVar80 = uStack_868._4_4_;
      local_870 = auVar100._0_8_;
      uStack_868 = auVar100._8_8_;
      if (bVar91 != 0) {
        auVar109 = vmulps_avx512vl(local_500,auVar109);
        auVar118 = vfmadd213ps_avx512vl(auVar118,local_4e0,auVar109);
        auVar108 = vfmadd213ps_avx512vl(auVar108,local_4c0,auVar118);
        auVar109 = vfmadd213ps_avx512vl(auVar107,local_4a0,auVar108);
        auVar119 = vmulps_avx512vl(local_500,auVar119);
        auVar120 = vfmadd213ps_avx512vl(auVar120,local_4e0,auVar119);
        auVar108 = vfmadd213ps_avx512vl(auVar122,local_4c0,auVar120);
        auVar122 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x1210);
        auVar120 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x1694);
        auVar119 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x1b18);
        auVar107 = *(undefined1 (*) [32])(bezier_basis0 + lVar37 + 0x1f9c);
        auVar114 = vfmadd213ps_avx512vl(auVar121,local_4a0,auVar108);
        auVar121 = vmulps_avx512vl(_local_720,auVar107);
        auVar108 = vmulps_avx512vl(_local_740,auVar107);
        auVar107 = vmulps_avx512vl(local_500,auVar107);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar119,local_6e0);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar119,local_700);
        auVar119 = vfmadd231ps_avx512vl(auVar107,local_4e0,auVar119);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar120,local_6a0);
        auVar107 = vfmadd231ps_avx512vl(auVar108,auVar120,local_6c0);
        auVar108 = vfmadd231ps_avx512vl(auVar119,local_4c0,auVar120);
        auVar95 = vfmadd231ps_fma(auVar121,auVar122,local_660);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar122,local_680);
        auVar121 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x1210);
        auVar120 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x1b18);
        auVar119 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x1f9c);
        auVar108 = vfmadd231ps_avx512vl(auVar108,local_4a0,auVar122);
        auVar122 = vmulps_avx512vl(_local_720,auVar119);
        auVar118 = vmulps_avx512vl(_local_740,auVar119);
        auVar119 = vmulps_avx512vl(local_500,auVar119);
        auVar117 = vfmadd231ps_avx512vl(auVar122,auVar120,local_6e0);
        auVar118 = vfmadd231ps_avx512vl(auVar118,auVar120,local_700);
        auVar120 = vfmadd231ps_avx512vl(auVar119,local_4e0,auVar120);
        auVar122 = *(undefined1 (*) [32])(bezier_basis1 + lVar37 + 0x1694);
        auVar119 = vfmadd231ps_avx512vl(auVar117,auVar122,local_6a0);
        auVar118 = vfmadd231ps_avx512vl(auVar118,auVar122,local_6c0);
        auVar122 = vfmadd231ps_avx512vl(auVar120,local_4c0,auVar122);
        auVar96 = vfmadd231ps_fma(auVar119,auVar121,local_660);
        auVar120 = vfmadd231ps_avx512vl(auVar118,auVar121,local_680);
        auVar119 = vfmadd231ps_avx512vl(auVar122,local_4a0,auVar121);
        auVar247 = ZEXT1664(auVar247._0_16_);
        auVar104 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
        auVar173 = ZEXT1664(auVar104);
        auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar246 = ZEXT1664(auVar104);
        auVar240._8_4_ = 0x7fffffff;
        auVar240._0_8_ = 0x7fffffff7fffffff;
        auVar240._12_4_ = 0x7fffffff;
        auVar240._16_4_ = 0x7fffffff;
        auVar240._20_4_ = 0x7fffffff;
        auVar240._24_4_ = 0x7fffffff;
        auVar240._28_4_ = 0x7fffffff;
        auVar121 = vandps_avx(ZEXT1632(auVar95),auVar240);
        auVar122 = vandps_avx(auVar107,auVar240);
        auVar122 = vmaxps_avx(auVar121,auVar122);
        auVar121 = vandps_avx(auVar108,auVar240);
        auVar121 = vmaxps_avx(auVar122,auVar121);
        auVar232._4_4_ = fVar185;
        auVar232._0_4_ = fVar185;
        auVar232._8_4_ = fVar185;
        auVar232._12_4_ = fVar185;
        auVar232._16_4_ = fVar185;
        auVar232._20_4_ = fVar185;
        auVar232._24_4_ = fVar185;
        auVar232._28_4_ = fVar185;
        uVar83 = vcmpps_avx512vl(auVar121,auVar232,1);
        bVar14 = (bool)((byte)uVar83 & 1);
        auVar117._0_4_ = (float)((uint)bVar14 * auVar112._0_4_ | (uint)!bVar14 * auVar95._0_4_);
        bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar117._4_4_ = (float)((uint)bVar14 * auVar112._4_4_ | (uint)!bVar14 * auVar95._4_4_);
        bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar117._8_4_ = (float)((uint)bVar14 * auVar112._8_4_ | (uint)!bVar14 * auVar95._8_4_);
        bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar117._12_4_ = (float)((uint)bVar14 * auVar112._12_4_ | (uint)!bVar14 * auVar95._12_4_);
        fVar185 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar112._16_4_);
        auVar117._16_4_ = fVar185;
        fVar229 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar112._20_4_);
        auVar117._20_4_ = fVar229;
        fVar230 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar112._24_4_);
        auVar117._24_4_ = fVar230;
        auVar117._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar112._28_4_;
        bVar14 = (bool)((byte)uVar83 & 1);
        auVar123._0_4_ = (float)((uint)bVar14 * auVar113._0_4_ | (uint)!bVar14 * auVar107._0_4_);
        bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar14 * auVar113._4_4_ | (uint)!bVar14 * auVar107._4_4_);
        bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar14 * auVar113._8_4_ | (uint)!bVar14 * auVar107._8_4_);
        bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar14 * auVar113._12_4_ | (uint)!bVar14 * auVar107._12_4_);
        bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar123._16_4_ = (float)((uint)bVar14 * auVar113._16_4_ | (uint)!bVar14 * auVar107._16_4_);
        bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar123._20_4_ = (float)((uint)bVar14 * auVar113._20_4_ | (uint)!bVar14 * auVar107._20_4_);
        bVar14 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar123._24_4_ = (float)((uint)bVar14 * auVar113._24_4_ | (uint)!bVar14 * auVar107._24_4_);
        bVar14 = SUB81(uVar83 >> 7,0);
        auVar123._28_4_ = (uint)bVar14 * auVar113._28_4_ | (uint)!bVar14 * auVar107._28_4_;
        auVar121 = vandps_avx(auVar240,ZEXT1632(auVar96));
        auVar122 = vandps_avx(auVar120,auVar240);
        auVar122 = vmaxps_avx(auVar121,auVar122);
        auVar121 = vandps_avx(auVar119,auVar240);
        auVar121 = vmaxps_avx(auVar122,auVar121);
        uVar83 = vcmpps_avx512vl(auVar121,auVar232,1);
        bVar14 = (bool)((byte)uVar83 & 1);
        auVar124._0_4_ = (float)((uint)bVar14 * auVar112._0_4_ | (uint)!bVar14 * auVar96._0_4_);
        bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar124._4_4_ = (float)((uint)bVar14 * auVar112._4_4_ | (uint)!bVar14 * auVar96._4_4_);
        bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar124._8_4_ = (float)((uint)bVar14 * auVar112._8_4_ | (uint)!bVar14 * auVar96._8_4_);
        bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar124._12_4_ = (float)((uint)bVar14 * auVar112._12_4_ | (uint)!bVar14 * auVar96._12_4_);
        fVar197 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar112._16_4_);
        auVar124._16_4_ = fVar197;
        fVar184 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar112._20_4_);
        auVar124._20_4_ = fVar184;
        fVar177 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar112._24_4_);
        auVar124._24_4_ = fVar177;
        uVar84 = (uint)(byte)(uVar83 >> 7) * auVar112._28_4_;
        auVar124._28_4_ = uVar84;
        bVar14 = (bool)((byte)uVar83 & 1);
        auVar125._0_4_ = (float)((uint)bVar14 * auVar113._0_4_ | (uint)!bVar14 * auVar120._0_4_);
        bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar125._4_4_ = (float)((uint)bVar14 * auVar113._4_4_ | (uint)!bVar14 * auVar120._4_4_);
        bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar125._8_4_ = (float)((uint)bVar14 * auVar113._8_4_ | (uint)!bVar14 * auVar120._8_4_);
        bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar125._12_4_ = (float)((uint)bVar14 * auVar113._12_4_ | (uint)!bVar14 * auVar120._12_4_);
        bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar125._16_4_ = (float)((uint)bVar14 * auVar113._16_4_ | (uint)!bVar14 * auVar120._16_4_);
        bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar125._20_4_ = (float)((uint)bVar14 * auVar113._20_4_ | (uint)!bVar14 * auVar120._20_4_);
        bVar14 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar125._24_4_ = (float)((uint)bVar14 * auVar113._24_4_ | (uint)!bVar14 * auVar120._24_4_);
        bVar14 = SUB81(uVar83 >> 7,0);
        auVar125._28_4_ = (uint)bVar14 * auVar113._28_4_ | (uint)!bVar14 * auVar120._28_4_;
        auVar105 = vxorps_avx512vl(auVar200,auVar200);
        auVar121 = vfmadd213ps_avx512vl(auVar117,auVar117,ZEXT1632(auVar105));
        auVar95 = vfmadd231ps_fma(auVar121,auVar123,auVar123);
        auVar122 = vrsqrt14ps_avx512vl(ZEXT1632(auVar95));
        fVar93 = auVar122._0_4_;
        fVar94 = auVar122._4_4_;
        fVar148 = auVar122._8_4_;
        fVar149 = auVar122._12_4_;
        fVar150 = auVar122._16_4_;
        fVar151 = auVar122._20_4_;
        fVar153 = auVar122._24_4_;
        auVar121._4_4_ = fVar94 * fVar94 * fVar94 * auVar95._4_4_ * -0.5;
        auVar121._0_4_ = fVar93 * fVar93 * fVar93 * auVar95._0_4_ * -0.5;
        auVar121._8_4_ = fVar148 * fVar148 * fVar148 * auVar95._8_4_ * -0.5;
        auVar121._12_4_ = fVar149 * fVar149 * fVar149 * auVar95._12_4_ * -0.5;
        auVar121._16_4_ = fVar150 * fVar150 * fVar150 * -0.0;
        auVar121._20_4_ = fVar151 * fVar151 * fVar151 * -0.0;
        auVar121._24_4_ = fVar153 * fVar153 * fVar153 * -0.0;
        auVar121._28_4_ = auVar119._28_4_;
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar107,auVar122);
        auVar122._4_4_ = auVar123._4_4_ * auVar121._4_4_;
        auVar122._0_4_ = auVar123._0_4_ * auVar121._0_4_;
        auVar122._8_4_ = auVar123._8_4_ * auVar121._8_4_;
        auVar122._12_4_ = auVar123._12_4_ * auVar121._12_4_;
        auVar122._16_4_ = auVar123._16_4_ * auVar121._16_4_;
        auVar122._20_4_ = auVar123._20_4_ * auVar121._20_4_;
        auVar122._24_4_ = auVar123._24_4_ * auVar121._24_4_;
        auVar122._28_4_ = 0;
        auVar120._4_4_ = auVar121._4_4_ * -auVar117._4_4_;
        auVar120._0_4_ = auVar121._0_4_ * -auVar117._0_4_;
        auVar120._8_4_ = auVar121._8_4_ * -auVar117._8_4_;
        auVar120._12_4_ = auVar121._12_4_ * -auVar117._12_4_;
        auVar120._16_4_ = auVar121._16_4_ * -fVar185;
        auVar120._20_4_ = auVar121._20_4_ * -fVar229;
        auVar120._24_4_ = auVar121._24_4_ * -fVar230;
        auVar120._28_4_ = auVar123._28_4_;
        auVar121 = vmulps_avx512vl(auVar121,ZEXT1632(auVar105));
        auVar113 = ZEXT1632(auVar105);
        auVar119 = vfmadd213ps_avx512vl(auVar124,auVar124,auVar113);
        auVar95 = vfmadd231ps_fma(auVar119,auVar125,auVar125);
        auVar118 = vrsqrt14ps_avx512vl(ZEXT1632(auVar95));
        fVar185 = auVar118._0_4_;
        fVar229 = auVar118._4_4_;
        fVar230 = auVar118._8_4_;
        fVar93 = auVar118._12_4_;
        fVar94 = auVar118._16_4_;
        fVar148 = auVar118._20_4_;
        fVar149 = auVar118._24_4_;
        auVar119._4_4_ = fVar229 * fVar229 * fVar229 * auVar95._4_4_ * -0.5;
        auVar119._0_4_ = fVar185 * fVar185 * fVar185 * auVar95._0_4_ * -0.5;
        auVar119._8_4_ = fVar230 * fVar230 * fVar230 * auVar95._8_4_ * -0.5;
        auVar119._12_4_ = fVar93 * fVar93 * fVar93 * auVar95._12_4_ * -0.5;
        auVar119._16_4_ = fVar94 * fVar94 * fVar94 * -0.0;
        auVar119._20_4_ = fVar148 * fVar148 * fVar148 * -0.0;
        auVar119._24_4_ = fVar149 * fVar149 * fVar149 * -0.0;
        auVar119._28_4_ = 0;
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar107,auVar118);
        auVar108._4_4_ = auVar125._4_4_ * auVar119._4_4_;
        auVar108._0_4_ = auVar125._0_4_ * auVar119._0_4_;
        auVar108._8_4_ = auVar125._8_4_ * auVar119._8_4_;
        auVar108._12_4_ = auVar125._12_4_ * auVar119._12_4_;
        auVar108._16_4_ = auVar125._16_4_ * auVar119._16_4_;
        auVar108._20_4_ = auVar125._20_4_ * auVar119._20_4_;
        auVar108._24_4_ = auVar125._24_4_ * auVar119._24_4_;
        auVar108._28_4_ = auVar118._28_4_;
        auVar118._4_4_ = -auVar124._4_4_ * auVar119._4_4_;
        auVar118._0_4_ = -auVar124._0_4_ * auVar119._0_4_;
        auVar118._8_4_ = -auVar124._8_4_ * auVar119._8_4_;
        auVar118._12_4_ = -auVar124._12_4_ * auVar119._12_4_;
        auVar118._16_4_ = -fVar197 * auVar119._16_4_;
        auVar118._20_4_ = -fVar184 * auVar119._20_4_;
        auVar118._24_4_ = -fVar177 * auVar119._24_4_;
        auVar118._28_4_ = uVar84 ^ 0x80000000;
        auVar119 = vmulps_avx512vl(auVar119,auVar113);
        auVar95 = vfmadd213ps_fma(auVar122,auVar115,auVar110);
        auVar96 = vfmadd213ps_fma(auVar120,auVar115,auVar111);
        auVar107 = vfmadd213ps_avx512vl(auVar121,auVar115,auVar114);
        auVar112 = vfmadd213ps_avx512vl(auVar108,ZEXT1632(auVar34),ZEXT1632(auVar32));
        auVar100 = vfnmadd213ps_fma(auVar122,auVar115,auVar110);
        auVar110 = ZEXT1632(auVar34);
        auVar104 = vfmadd213ps_fma(auVar118,auVar110,ZEXT1632(auVar33));
        auVar103 = vfnmadd213ps_fma(auVar120,auVar115,auVar111);
        auVar29 = vfmadd213ps_fma(auVar119,auVar110,auVar109);
        auVar122 = vfnmadd231ps_avx512vl(auVar114,auVar115,auVar121);
        auVar32 = vfnmadd213ps_fma(auVar108,auVar110,ZEXT1632(auVar32));
        auVar33 = vfnmadd213ps_fma(auVar118,auVar110,ZEXT1632(auVar33));
        auVar245 = vfnmadd231ps_fma(auVar109,ZEXT1632(auVar34),auVar119);
        auVar120 = vsubps_avx512vl(auVar112,ZEXT1632(auVar100));
        auVar121 = vsubps_avx(ZEXT1632(auVar104),ZEXT1632(auVar103));
        auVar119 = vsubps_avx512vl(ZEXT1632(auVar29),auVar122);
        auVar108 = vmulps_avx512vl(auVar121,auVar122);
        auVar30 = vfmsub231ps_fma(auVar108,ZEXT1632(auVar103),auVar119);
        auVar109._4_4_ = auVar100._4_4_ * auVar119._4_4_;
        auVar109._0_4_ = auVar100._0_4_ * auVar119._0_4_;
        auVar109._8_4_ = auVar100._8_4_ * auVar119._8_4_;
        auVar109._12_4_ = auVar100._12_4_ * auVar119._12_4_;
        auVar109._16_4_ = auVar119._16_4_ * 0.0;
        auVar109._20_4_ = auVar119._20_4_ * 0.0;
        auVar109._24_4_ = auVar119._24_4_ * 0.0;
        auVar109._28_4_ = auVar119._28_4_;
        auVar119 = vfmsub231ps_avx512vl(auVar109,auVar122,auVar120);
        auVar110._4_4_ = auVar103._4_4_ * auVar120._4_4_;
        auVar110._0_4_ = auVar103._0_4_ * auVar120._0_4_;
        auVar110._8_4_ = auVar103._8_4_ * auVar120._8_4_;
        auVar110._12_4_ = auVar103._12_4_ * auVar120._12_4_;
        auVar110._16_4_ = auVar120._16_4_ * 0.0;
        auVar110._20_4_ = auVar120._20_4_ * 0.0;
        auVar110._24_4_ = auVar120._24_4_ * 0.0;
        auVar110._28_4_ = auVar120._28_4_;
        auVar31 = vfmsub231ps_fma(auVar110,ZEXT1632(auVar100),auVar121);
        auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar31),auVar113,auVar119);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar113,ZEXT1632(auVar30));
        auVar114 = ZEXT1632(auVar105);
        uVar83 = vcmpps_avx512vl(auVar121,auVar114,2);
        bVar82 = (byte)uVar83;
        fVar93 = (float)((uint)(bVar82 & 1) * auVar95._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar32._0_4_);
        bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
        fVar148 = (float)((uint)bVar14 * auVar95._4_4_ | (uint)!bVar14 * auVar32._4_4_);
        bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
        fVar150 = (float)((uint)bVar14 * auVar95._8_4_ | (uint)!bVar14 * auVar32._8_4_);
        bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
        fVar153 = (float)((uint)bVar14 * auVar95._12_4_ | (uint)!bVar14 * auVar32._12_4_);
        auVar118 = ZEXT1632(CONCAT412(fVar153,CONCAT48(fVar150,CONCAT44(fVar148,fVar93))));
        fVar94 = (float)((uint)(bVar82 & 1) * auVar96._0_4_ |
                        (uint)!(bool)(bVar82 & 1) * auVar33._0_4_);
        bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
        fVar149 = (float)((uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar33._4_4_);
        bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
        fVar151 = (float)((uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar33._8_4_);
        bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
        fVar154 = (float)((uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar33._12_4_);
        auVar109 = ZEXT1632(CONCAT412(fVar154,CONCAT48(fVar151,CONCAT44(fVar149,fVar94))));
        auVar126._0_4_ =
             (float)((uint)(bVar82 & 1) * auVar107._0_4_ |
                    (uint)!(bool)(bVar82 & 1) * auVar245._0_4_);
        bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar126._4_4_ = (float)((uint)bVar14 * auVar107._4_4_ | (uint)!bVar14 * auVar245._4_4_);
        bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar126._8_4_ = (float)((uint)bVar14 * auVar107._8_4_ | (uint)!bVar14 * auVar245._8_4_);
        bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar126._12_4_ = (float)((uint)bVar14 * auVar107._12_4_ | (uint)!bVar14 * auVar245._12_4_);
        fVar185 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar107._16_4_);
        auVar126._16_4_ = fVar185;
        fVar230 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar107._20_4_);
        auVar126._20_4_ = fVar230;
        fVar229 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar107._24_4_);
        auVar126._24_4_ = fVar229;
        iVar1 = (uint)(byte)(uVar83 >> 7) * auVar107._28_4_;
        auVar126._28_4_ = iVar1;
        auVar120 = vblendmps_avx512vl(ZEXT1632(auVar100),auVar112);
        auVar127._0_4_ =
             (uint)(bVar82 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar30._0_4_;
        bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar127._4_4_ = (uint)bVar14 * auVar120._4_4_ | (uint)!bVar14 * auVar30._4_4_;
        bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar127._8_4_ = (uint)bVar14 * auVar120._8_4_ | (uint)!bVar14 * auVar30._8_4_;
        bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar127._12_4_ = (uint)bVar14 * auVar120._12_4_ | (uint)!bVar14 * auVar30._12_4_;
        auVar127._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar120._16_4_;
        auVar127._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar120._20_4_;
        auVar127._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar120._24_4_;
        auVar127._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar120._28_4_;
        auVar120 = vblendmps_avx512vl(ZEXT1632(auVar103),ZEXT1632(auVar104));
        auVar128._0_4_ =
             (float)((uint)(bVar82 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar96._0_4_
                    );
        bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar128._4_4_ = (float)((uint)bVar14 * auVar120._4_4_ | (uint)!bVar14 * auVar96._4_4_);
        bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar128._8_4_ = (float)((uint)bVar14 * auVar120._8_4_ | (uint)!bVar14 * auVar96._8_4_);
        bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar128._12_4_ = (float)((uint)bVar14 * auVar120._12_4_ | (uint)!bVar14 * auVar96._12_4_);
        fVar177 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar120._16_4_);
        auVar128._16_4_ = fVar177;
        fVar184 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar120._20_4_);
        auVar128._20_4_ = fVar184;
        fVar197 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar120._24_4_);
        auVar128._24_4_ = fVar197;
        auVar128._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar120._28_4_;
        auVar120 = vblendmps_avx512vl(auVar122,ZEXT1632(auVar29));
        auVar129._0_4_ =
             (float)((uint)(bVar82 & 1) * auVar120._0_4_ |
                    (uint)!(bool)(bVar82 & 1) * auVar107._0_4_);
        bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar129._4_4_ = (float)((uint)bVar14 * auVar120._4_4_ | (uint)!bVar14 * auVar107._4_4_);
        bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar129._8_4_ = (float)((uint)bVar14 * auVar120._8_4_ | (uint)!bVar14 * auVar107._8_4_);
        bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar129._12_4_ = (float)((uint)bVar14 * auVar120._12_4_ | (uint)!bVar14 * auVar107._12_4_);
        bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar129._16_4_ = (float)((uint)bVar14 * auVar120._16_4_ | (uint)!bVar14 * auVar107._16_4_);
        bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar129._20_4_ = (float)((uint)bVar14 * auVar120._20_4_ | (uint)!bVar14 * auVar107._20_4_);
        bVar14 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar129._24_4_ = (float)((uint)bVar14 * auVar120._24_4_ | (uint)!bVar14 * auVar107._24_4_);
        bVar14 = SUB81(uVar83 >> 7,0);
        auVar129._28_4_ = (uint)bVar14 * auVar120._28_4_ | (uint)!bVar14 * auVar107._28_4_;
        auVar130._0_4_ =
             (uint)(bVar82 & 1) * (int)auVar100._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar112._0_4_;
        bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar130._4_4_ = (uint)bVar14 * (int)auVar100._4_4_ | (uint)!bVar14 * auVar112._4_4_;
        bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar130._8_4_ = (uint)bVar14 * (int)auVar100._8_4_ | (uint)!bVar14 * auVar112._8_4_;
        bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar130._12_4_ = (uint)bVar14 * (int)auVar100._12_4_ | (uint)!bVar14 * auVar112._12_4_;
        auVar130._16_4_ = (uint)!(bool)((byte)(uVar83 >> 4) & 1) * auVar112._16_4_;
        auVar130._20_4_ = (uint)!(bool)((byte)(uVar83 >> 5) & 1) * auVar112._20_4_;
        auVar130._24_4_ = (uint)!(bool)((byte)(uVar83 >> 6) & 1) * auVar112._24_4_;
        auVar130._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar112._28_4_;
        bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar131._0_4_ =
             (uint)(bVar82 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar29._0_4_;
        bVar15 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar131._4_4_ = (uint)bVar15 * auVar122._4_4_ | (uint)!bVar15 * auVar29._4_4_;
        bVar15 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar131._8_4_ = (uint)bVar15 * auVar122._8_4_ | (uint)!bVar15 * auVar29._8_4_;
        bVar15 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar131._12_4_ = (uint)bVar15 * auVar122._12_4_ | (uint)!bVar15 * auVar29._12_4_;
        auVar131._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar122._16_4_;
        auVar131._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar122._20_4_;
        auVar131._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar122._24_4_;
        iVar2 = (uint)(byte)(uVar83 >> 7) * auVar122._28_4_;
        auVar131._28_4_ = iVar2;
        auVar110 = vsubps_avx512vl(auVar130,auVar118);
        auVar122 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar103._12_4_ |
                                                 (uint)!bVar17 * auVar104._12_4_,
                                                 CONCAT48((uint)bVar16 * (int)auVar103._8_4_ |
                                                          (uint)!bVar16 * auVar104._8_4_,
                                                          CONCAT44((uint)bVar14 *
                                                                   (int)auVar103._4_4_ |
                                                                   (uint)!bVar14 * auVar104._4_4_,
                                                                   (uint)(bVar82 & 1) *
                                                                   (int)auVar103._0_4_ |
                                                                   (uint)!(bool)(bVar82 & 1) *
                                                                   auVar104._0_4_)))),auVar109);
        auVar222 = ZEXT3264(auVar122);
        auVar120 = vsubps_avx(auVar131,auVar126);
        auVar119 = vsubps_avx(auVar118,auVar127);
        auVar227 = ZEXT3264(auVar119);
        auVar107 = vsubps_avx(auVar109,auVar128);
        auVar108 = vsubps_avx(auVar126,auVar129);
        auVar111._4_4_ = auVar120._4_4_ * fVar148;
        auVar111._0_4_ = auVar120._0_4_ * fVar93;
        auVar111._8_4_ = auVar120._8_4_ * fVar150;
        auVar111._12_4_ = auVar120._12_4_ * fVar153;
        auVar111._16_4_ = auVar120._16_4_ * 0.0;
        auVar111._20_4_ = auVar120._20_4_ * 0.0;
        auVar111._24_4_ = auVar120._24_4_ * 0.0;
        auVar111._28_4_ = iVar2;
        auVar95 = vfmsub231ps_fma(auVar111,auVar126,auVar110);
        auVar112._4_4_ = fVar149 * auVar110._4_4_;
        auVar112._0_4_ = fVar94 * auVar110._0_4_;
        auVar112._8_4_ = fVar151 * auVar110._8_4_;
        auVar112._12_4_ = fVar154 * auVar110._12_4_;
        auVar112._16_4_ = auVar110._16_4_ * 0.0;
        auVar112._20_4_ = auVar110._20_4_ * 0.0;
        auVar112._24_4_ = auVar110._24_4_ * 0.0;
        auVar112._28_4_ = auVar121._28_4_;
        auVar96 = vfmsub231ps_fma(auVar112,auVar118,auVar122);
        auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar114,ZEXT1632(auVar95));
        auVar210._0_4_ = auVar122._0_4_ * auVar126._0_4_;
        auVar210._4_4_ = auVar122._4_4_ * auVar126._4_4_;
        auVar210._8_4_ = auVar122._8_4_ * auVar126._8_4_;
        auVar210._12_4_ = auVar122._12_4_ * auVar126._12_4_;
        auVar210._16_4_ = auVar122._16_4_ * fVar185;
        auVar210._20_4_ = auVar122._20_4_ * fVar230;
        auVar210._24_4_ = auVar122._24_4_ * fVar229;
        auVar210._28_4_ = 0;
        auVar95 = vfmsub231ps_fma(auVar210,auVar109,auVar120);
        auVar111 = vfmadd231ps_avx512vl(auVar121,auVar114,ZEXT1632(auVar95));
        auVar121 = vmulps_avx512vl(auVar108,auVar127);
        auVar121 = vfmsub231ps_avx512vl(auVar121,auVar119,auVar129);
        auVar113._4_4_ = auVar107._4_4_ * auVar129._4_4_;
        auVar113._0_4_ = auVar107._0_4_ * auVar129._0_4_;
        auVar113._8_4_ = auVar107._8_4_ * auVar129._8_4_;
        auVar113._12_4_ = auVar107._12_4_ * auVar129._12_4_;
        auVar113._16_4_ = auVar107._16_4_ * auVar129._16_4_;
        auVar113._20_4_ = auVar107._20_4_ * auVar129._20_4_;
        auVar113._24_4_ = auVar107._24_4_ * auVar129._24_4_;
        auVar113._28_4_ = auVar129._28_4_;
        auVar95 = vfmsub231ps_fma(auVar113,auVar128,auVar108);
        auVar211._0_4_ = auVar128._0_4_ * auVar119._0_4_;
        auVar211._4_4_ = auVar128._4_4_ * auVar119._4_4_;
        auVar211._8_4_ = auVar128._8_4_ * auVar119._8_4_;
        auVar211._12_4_ = auVar128._12_4_ * auVar119._12_4_;
        auVar211._16_4_ = fVar177 * auVar119._16_4_;
        auVar211._20_4_ = fVar184 * auVar119._20_4_;
        auVar211._24_4_ = fVar197 * auVar119._24_4_;
        auVar211._28_4_ = 0;
        auVar96 = vfmsub231ps_fma(auVar211,auVar107,auVar127);
        auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar114,auVar121);
        auVar112 = vfmadd231ps_avx512vl(auVar121,auVar114,ZEXT1632(auVar95));
        auVar214 = ZEXT3264(auVar112);
        auVar121 = vmaxps_avx(auVar111,auVar112);
        uVar178 = vcmpps_avx512vl(auVar121,auVar114,2);
        bVar91 = bVar91 & (byte)uVar178;
        if (bVar91 != 0) {
          uVar157 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar241._4_4_ = uVar157;
          auVar241._0_4_ = uVar157;
          auVar241._8_4_ = uVar157;
          auVar241._12_4_ = uVar157;
          auVar241._16_4_ = uVar157;
          auVar241._20_4_ = uVar157;
          auVar241._24_4_ = uVar157;
          auVar241._28_4_ = uVar157;
          auVar244 = ZEXT3264(auVar241);
          auVar44._4_4_ = auVar108._4_4_ * auVar122._4_4_;
          auVar44._0_4_ = auVar108._0_4_ * auVar122._0_4_;
          auVar44._8_4_ = auVar108._8_4_ * auVar122._8_4_;
          auVar44._12_4_ = auVar108._12_4_ * auVar122._12_4_;
          auVar44._16_4_ = auVar108._16_4_ * auVar122._16_4_;
          auVar44._20_4_ = auVar108._20_4_ * auVar122._20_4_;
          auVar44._24_4_ = auVar108._24_4_ * auVar122._24_4_;
          auVar44._28_4_ = auVar121._28_4_;
          auVar29 = vfmsub231ps_fma(auVar44,auVar107,auVar120);
          auVar45._4_4_ = auVar120._4_4_ * auVar119._4_4_;
          auVar45._0_4_ = auVar120._0_4_ * auVar119._0_4_;
          auVar45._8_4_ = auVar120._8_4_ * auVar119._8_4_;
          auVar45._12_4_ = auVar120._12_4_ * auVar119._12_4_;
          auVar45._16_4_ = auVar120._16_4_ * auVar119._16_4_;
          auVar45._20_4_ = auVar120._20_4_ * auVar119._20_4_;
          auVar45._24_4_ = auVar120._24_4_ * auVar119._24_4_;
          auVar45._28_4_ = auVar120._28_4_;
          auVar104 = vfmsub231ps_fma(auVar45,auVar110,auVar108);
          auVar46._4_4_ = auVar107._4_4_ * auVar110._4_4_;
          auVar46._0_4_ = auVar107._0_4_ * auVar110._0_4_;
          auVar46._8_4_ = auVar107._8_4_ * auVar110._8_4_;
          auVar46._12_4_ = auVar107._12_4_ * auVar110._12_4_;
          auVar46._16_4_ = auVar107._16_4_ * auVar110._16_4_;
          auVar46._20_4_ = auVar107._20_4_ * auVar110._20_4_;
          auVar46._24_4_ = auVar107._24_4_ * auVar110._24_4_;
          auVar46._28_4_ = auVar107._28_4_;
          auVar30 = vfmsub231ps_fma(auVar46,auVar119,auVar122);
          auVar95 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar104),ZEXT1632(auVar30));
          auVar96 = vfmadd231ps_fma(ZEXT1632(auVar95),ZEXT1632(auVar29),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          auVar121 = vrcp14ps_avx512vl(ZEXT1632(auVar96));
          auVar39._8_4_ = 0x3f800000;
          auVar39._0_8_ = 0x3f8000003f800000;
          auVar39._12_4_ = 0x3f800000;
          auVar39._16_4_ = 0x3f800000;
          auVar39._20_4_ = 0x3f800000;
          auVar39._24_4_ = 0x3f800000;
          auVar39._28_4_ = 0x3f800000;
          auVar122 = vfnmadd213ps_avx512vl(auVar121,ZEXT1632(auVar96),auVar39);
          auVar95 = vfmadd132ps_fma(auVar122,auVar121,auVar121);
          auVar222 = ZEXT1664(auVar95);
          auVar47._4_4_ = auVar30._4_4_ * auVar126._4_4_;
          auVar47._0_4_ = auVar30._0_4_ * auVar126._0_4_;
          auVar47._8_4_ = auVar30._8_4_ * auVar126._8_4_;
          auVar47._12_4_ = auVar30._12_4_ * auVar126._12_4_;
          auVar47._16_4_ = fVar185 * 0.0;
          auVar47._20_4_ = fVar230 * 0.0;
          auVar47._24_4_ = fVar229 * 0.0;
          auVar47._28_4_ = iVar1;
          auVar104 = vfmadd231ps_fma(auVar47,auVar109,ZEXT1632(auVar104));
          auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar118,ZEXT1632(auVar29));
          fVar185 = auVar95._0_4_;
          fVar229 = auVar95._4_4_;
          fVar230 = auVar95._8_4_;
          fVar177 = auVar95._12_4_;
          local_800._28_4_ = auVar121._28_4_;
          local_800._0_28_ =
               ZEXT1628(CONCAT412(auVar104._12_4_ * fVar177,
                                  CONCAT48(auVar104._8_4_ * fVar230,
                                           CONCAT44(auVar104._4_4_ * fVar229,
                                                    auVar104._0_4_ * fVar185))));
          auVar227 = ZEXT3264(local_800);
          auVar165._4_4_ = local_7a0;
          auVar165._0_4_ = local_7a0;
          auVar165._8_4_ = local_7a0;
          auVar165._12_4_ = local_7a0;
          auVar165._16_4_ = local_7a0;
          auVar165._20_4_ = local_7a0;
          auVar165._24_4_ = local_7a0;
          auVar165._28_4_ = local_7a0;
          uVar178 = vcmpps_avx512vl(local_800,auVar241,2);
          uVar35 = vcmpps_avx512vl(auVar165,local_800,2);
          bVar91 = (byte)uVar178 & (byte)uVar35 & bVar91;
          if (bVar91 != 0) {
            uVar92 = vcmpps_avx512vl(ZEXT1632(auVar96),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar92 = bVar91 & uVar92;
            if ((char)uVar92 != '\0') {
              fVar184 = auVar111._0_4_ * fVar185;
              fVar197 = auVar111._4_4_ * fVar229;
              auVar48._4_4_ = fVar197;
              auVar48._0_4_ = fVar184;
              fVar93 = auVar111._8_4_ * fVar230;
              auVar48._8_4_ = fVar93;
              fVar94 = auVar111._12_4_ * fVar177;
              auVar48._12_4_ = fVar94;
              fVar148 = auVar111._16_4_ * 0.0;
              auVar48._16_4_ = fVar148;
              fVar149 = auVar111._20_4_ * 0.0;
              auVar48._20_4_ = fVar149;
              fVar150 = auVar111._24_4_ * 0.0;
              auVar48._24_4_ = fVar150;
              auVar48._28_4_ = auVar111._28_4_;
              auVar166._8_4_ = 0x3f800000;
              auVar166._0_8_ = 0x3f8000003f800000;
              auVar166._12_4_ = 0x3f800000;
              auVar166._16_4_ = 0x3f800000;
              auVar166._20_4_ = 0x3f800000;
              auVar166._24_4_ = 0x3f800000;
              auVar166._28_4_ = 0x3f800000;
              auVar121 = vsubps_avx(auVar166,auVar48);
              local_640._0_4_ =
                   (float)((uint)(bVar82 & 1) * (int)fVar184 |
                          (uint)!(bool)(bVar82 & 1) * auVar121._0_4_);
              bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
              local_640._4_4_ =
                   (float)((uint)bVar14 * (int)fVar197 | (uint)!bVar14 * auVar121._4_4_);
              bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
              local_640._8_4_ = (float)((uint)bVar14 * (int)fVar93 | (uint)!bVar14 * auVar121._8_4_)
              ;
              bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
              local_640._12_4_ =
                   (float)((uint)bVar14 * (int)fVar94 | (uint)!bVar14 * auVar121._12_4_);
              bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
              local_640._16_4_ =
                   (float)((uint)bVar14 * (int)fVar148 | (uint)!bVar14 * auVar121._16_4_);
              bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
              local_640._20_4_ =
                   (float)((uint)bVar14 * (int)fVar149 | (uint)!bVar14 * auVar121._20_4_);
              bVar14 = (bool)((byte)(uVar83 >> 6) & 1);
              local_640._24_4_ =
                   (float)((uint)bVar14 * (int)fVar150 | (uint)!bVar14 * auVar121._24_4_);
              bVar14 = SUB81(uVar83 >> 7,0);
              local_640._28_4_ =
                   (float)((uint)bVar14 * auVar111._28_4_ | (uint)!bVar14 * auVar121._28_4_);
              auVar121 = vsubps_avx(ZEXT1632(auVar34),auVar115);
              auVar95 = vfmadd213ps_fma(auVar121,local_640,auVar115);
              uVar157 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar115._4_4_ = uVar157;
              auVar115._0_4_ = uVar157;
              auVar115._8_4_ = uVar157;
              auVar115._12_4_ = uVar157;
              auVar115._16_4_ = uVar157;
              auVar115._20_4_ = uVar157;
              auVar115._24_4_ = uVar157;
              auVar115._28_4_ = uVar157;
              auVar121 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar95._12_4_ + auVar95._12_4_,
                                                            CONCAT48(auVar95._8_4_ + auVar95._8_4_,
                                                                     CONCAT44(auVar95._4_4_ +
                                                                              auVar95._4_4_,
                                                                              auVar95._0_4_ +
                                                                              auVar95._0_4_)))),
                                         auVar115);
              uVar36 = vcmpps_avx512vl(local_800,auVar121,6);
              uVar92 = uVar92 & uVar36;
              bVar91 = (byte)uVar92;
              if (bVar91 != 0) {
                auVar195._0_4_ = auVar112._0_4_ * fVar185;
                auVar195._4_4_ = auVar112._4_4_ * fVar229;
                auVar195._8_4_ = auVar112._8_4_ * fVar230;
                auVar195._12_4_ = auVar112._12_4_ * fVar177;
                auVar195._16_4_ = auVar112._16_4_ * 0.0;
                auVar195._20_4_ = auVar112._20_4_ * 0.0;
                auVar195._24_4_ = auVar112._24_4_ * 0.0;
                auVar195._28_4_ = 0;
                auVar205._8_4_ = 0x3f800000;
                auVar205._0_8_ = 0x3f8000003f800000;
                auVar205._12_4_ = 0x3f800000;
                auVar205._16_4_ = 0x3f800000;
                auVar205._20_4_ = 0x3f800000;
                auVar205._24_4_ = 0x3f800000;
                auVar205._28_4_ = 0x3f800000;
                auVar121 = vsubps_avx(auVar205,auVar195);
                auVar132._0_4_ =
                     (uint)(bVar82 & 1) * (int)auVar195._0_4_ |
                     (uint)!(bool)(bVar82 & 1) * auVar121._0_4_;
                bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
                auVar132._4_4_ = (uint)bVar14 * (int)auVar195._4_4_ | (uint)!bVar14 * auVar121._4_4_
                ;
                bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
                auVar132._8_4_ = (uint)bVar14 * (int)auVar195._8_4_ | (uint)!bVar14 * auVar121._8_4_
                ;
                bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
                auVar132._12_4_ =
                     (uint)bVar14 * (int)auVar195._12_4_ | (uint)!bVar14 * auVar121._12_4_;
                bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
                auVar132._16_4_ =
                     (uint)bVar14 * (int)auVar195._16_4_ | (uint)!bVar14 * auVar121._16_4_;
                bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
                auVar132._20_4_ =
                     (uint)bVar14 * (int)auVar195._20_4_ | (uint)!bVar14 * auVar121._20_4_;
                bVar14 = (bool)((byte)(uVar83 >> 6) & 1);
                auVar132._24_4_ =
                     (uint)bVar14 * (int)auVar195._24_4_ | (uint)!bVar14 * auVar121._24_4_;
                auVar132._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar121._28_4_;
                auVar40._8_4_ = 0x40000000;
                auVar40._0_8_ = 0x4000000040000000;
                auVar40._12_4_ = 0x40000000;
                auVar40._16_4_ = 0x40000000;
                auVar40._20_4_ = 0x40000000;
                auVar40._24_4_ = 0x40000000;
                auVar40._28_4_ = 0x40000000;
                local_620 = vfmsub132ps_avx512vl(auVar132,auVar205,auVar40);
                local_5e0 = 0;
                local_5d0 = local_860;
                uStack_5c8 = uStack_858;
                local_5c0 = local_880;
                uStack_5b8 = uStack_878;
                local_5b0 = local_890;
                uStack_5a8 = uStack_888;
                local_5a0 = local_870;
                uStack_598 = uStack_868;
                if ((pGVar88->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  fVar185 = 1.0 / auVar116._0_4_;
                  local_580[0] = fVar185 * (local_640._0_4_ + 0.0);
                  local_580[1] = fVar185 * (local_640._4_4_ + 1.0);
                  local_580[2] = fVar185 * (local_640._8_4_ + 2.0);
                  local_580[3] = fVar185 * (local_640._12_4_ + 3.0);
                  fStack_570 = fVar185 * (local_640._16_4_ + 4.0);
                  fStack_56c = fVar185 * (local_640._20_4_ + 5.0);
                  fStack_568 = fVar185 * (local_640._24_4_ + 6.0);
                  fStack_564 = local_640._28_4_ + 7.0;
                  local_560 = local_620;
                  local_540 = local_800;
                  auVar167._8_4_ = 0x7f800000;
                  auVar167._0_8_ = 0x7f8000007f800000;
                  auVar167._12_4_ = 0x7f800000;
                  auVar167._16_4_ = 0x7f800000;
                  auVar167._20_4_ = 0x7f800000;
                  auVar167._24_4_ = 0x7f800000;
                  auVar167._28_4_ = 0x7f800000;
                  auVar121 = vblendmps_avx512vl(auVar167,local_800);
                  auVar133._0_4_ =
                       (uint)(bVar91 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar91 & 1) * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
                  auVar133._4_4_ = (uint)bVar14 * auVar121._4_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
                  auVar133._8_4_ = (uint)bVar14 * auVar121._8_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
                  auVar133._12_4_ = (uint)bVar14 * auVar121._12_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
                  auVar133._16_4_ = (uint)bVar14 * auVar121._16_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar92 >> 5) & 1);
                  auVar133._20_4_ = (uint)bVar14 * auVar121._20_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar92 >> 6) & 1);
                  auVar133._24_4_ = (uint)bVar14 * auVar121._24_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = SUB81(uVar92 >> 7,0);
                  auVar133._28_4_ = (uint)bVar14 * auVar121._28_4_ | (uint)!bVar14 * 0x7f800000;
                  auVar121 = vshufps_avx(auVar133,auVar133,0xb1);
                  auVar121 = vminps_avx(auVar133,auVar121);
                  auVar122 = vshufpd_avx(auVar121,auVar121,5);
                  auVar121 = vminps_avx(auVar121,auVar122);
                  auVar122 = vpermpd_avx2(auVar121,0x4e);
                  auVar121 = vminps_avx(auVar121,auVar122);
                  uVar178 = vcmpps_avx512vl(auVar133,auVar121,0);
                  uVar84 = (uint)uVar92;
                  if (((byte)uVar178 & bVar91) != 0) {
                    uVar84 = (uint)((byte)uVar178 & bVar91);
                  }
                  uVar85 = 0;
                  for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
                    uVar85 = uVar85 + 1;
                  }
                  uVar83 = (ulong)uVar85;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar88->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar214 = vpbroadcastd_avx512f();
                    local_400 = vmovdqa64_avx512f(auVar214);
                    auVar214 = vpbroadcastd_avx512f();
                    local_440 = vmovdqa64_avx512f(auVar214);
                    local_600 = local_800;
                    local_5dc = iVar8;
                    do {
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_580[uVar83]));
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_560 + uVar83 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_540 + uVar83 * 4)
                      ;
                      local_848.context = context->user;
                      fVar177 = local_200._0_4_;
                      fVar229 = 1.0 - fVar177;
                      fVar185 = fVar229 * fVar229 * -3.0;
                      auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar229 * fVar229)),
                                                ZEXT416((uint)(fVar177 * fVar229)),
                                                ZEXT416(0xc0000000));
                      auVar96 = vfmsub132ss_fma(ZEXT416((uint)(fVar177 * fVar229)),
                                                ZEXT416((uint)(fVar177 * fVar177)),
                                                ZEXT416(0x40000000));
                      fVar229 = auVar95._0_4_ * 3.0;
                      fVar230 = auVar96._0_4_ * 3.0;
                      fVar177 = fVar177 * fVar177 * 3.0;
                      auVar221._0_4_ = fVar177 * fVar174;
                      auVar221._4_4_ = fVar177 * fVar175;
                      auVar221._8_4_ = fVar177 * fVar176;
                      auVar221._12_4_ = fVar177 * fVar80;
                      auVar163._4_4_ = fVar230;
                      auVar163._0_4_ = fVar230;
                      auVar163._8_4_ = fVar230;
                      auVar163._12_4_ = fVar230;
                      auVar95 = vfmadd132ps_fma(auVar163,auVar221,auVar102);
                      auVar204._4_4_ = fVar229;
                      auVar204._0_4_ = fVar229;
                      auVar204._8_4_ = fVar229;
                      auVar204._12_4_ = fVar229;
                      auVar95 = vfmadd132ps_fma(auVar204,auVar95,auVar101);
                      auVar164._4_4_ = fVar185;
                      auVar164._0_4_ = fVar185;
                      auVar164._8_4_ = fVar185;
                      auVar164._12_4_ = fVar185;
                      auVar95 = vfmadd132ps_fma(auVar164,auVar95,auVar28);
                      auVar147 = vbroadcastss_avx512f(auVar95);
                      auVar214 = vbroadcastss_avx512f(ZEXT416(1));
                      auVar214 = vpermps_avx512f(auVar214,ZEXT1664(auVar95));
                      auVar222 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar222,ZEXT1664(auVar95));
                      local_2c0[0] = (RTCHitN)auVar147[0];
                      local_2c0[1] = (RTCHitN)auVar147[1];
                      local_2c0[2] = (RTCHitN)auVar147[2];
                      local_2c0[3] = (RTCHitN)auVar147[3];
                      local_2c0[4] = (RTCHitN)auVar147[4];
                      local_2c0[5] = (RTCHitN)auVar147[5];
                      local_2c0[6] = (RTCHitN)auVar147[6];
                      local_2c0[7] = (RTCHitN)auVar147[7];
                      local_2c0[8] = (RTCHitN)auVar147[8];
                      local_2c0[9] = (RTCHitN)auVar147[9];
                      local_2c0[10] = (RTCHitN)auVar147[10];
                      local_2c0[0xb] = (RTCHitN)auVar147[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar147[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar147[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar147[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar147[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar147[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar147[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar147[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar147[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar147[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar147[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar147[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar147[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar147[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar147[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar147[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar147[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar147[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar147[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar147[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar147[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar147[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar147[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar147[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar147[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar147[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar147[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar147[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar147[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar147[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar147[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar147[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar147[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar147[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar147[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar147[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar147[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar147[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar147[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar147[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar147[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar147[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar147[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar147[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar147[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar147[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar147[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar147[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar147[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar147[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar147[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar147[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar147[0x3f];
                      local_280 = auVar214;
                      local_180 = local_440._0_8_;
                      uStack_178 = local_440._8_8_;
                      uStack_170 = local_440._16_8_;
                      uStack_168 = local_440._24_8_;
                      uStack_160 = local_440._32_8_;
                      uStack_158 = local_440._40_8_;
                      uStack_150 = local_440._48_8_;
                      uStack_148 = local_440._56_8_;
                      auVar147 = vmovdqa64_avx512f(local_400);
                      local_140 = vmovdqa64_avx512f(auVar147);
                      auVar121 = vpcmpeqd_avx2(auVar147._0_32_,auVar147._0_32_);
                      local_810[3] = auVar121;
                      local_810[2] = auVar121;
                      local_810[1] = auVar121;
                      *local_810 = auVar121;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_848.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_848.context)->instPrimID[0]));
                      auVar147 = vmovdqa64_avx512f(local_300);
                      local_780 = vmovdqa64_avx512f(auVar147);
                      local_848.valid = (int *)local_780;
                      local_848.geometryUserPtr = pGVar88->userPtr;
                      local_848.hit = local_2c0;
                      local_848.N = 0x10;
                      local_7c0 = auVar244._0_32_;
                      local_848.ray = (RTCRayN *)ray;
                      if (pGVar88->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar214 = ZEXT1664(auVar214._0_16_);
                        auVar222 = ZEXT1664(auVar222._0_16_);
                        (*pGVar88->intersectionFilterN)(&local_848);
                        auVar227 = ZEXT3264(local_800);
                        auVar244 = ZEXT3264(local_7c0);
                        auVar95 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
                        auVar173 = ZEXT1664(auVar95);
                        auVar247 = ZEXT464(0xbf800000);
                        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar246 = ZEXT1664(auVar95);
                        auVar147 = vmovdqa64_avx512f(local_780);
                      }
                      uVar178 = vptestmd_avx512f(auVar147,auVar147);
                      if ((short)uVar178 == 0) {
LAB_01bf5cc3:
                        *(int *)(ray + k * 4 + 0x200) = auVar244._0_4_;
                      }
                      else {
                        p_Var13 = context->args->filter;
                        if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar88->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar214 = ZEXT1664(auVar214._0_16_);
                          auVar222 = ZEXT1664(auVar222._0_16_);
                          (*p_Var13)(&local_848);
                          auVar227 = ZEXT3264(local_800);
                          auVar244 = ZEXT3264(local_7c0);
                          auVar95 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
                          auVar173 = ZEXT1664(auVar95);
                          auVar247 = ZEXT464(0xbf800000);
                          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar246 = ZEXT1664(auVar95);
                          auVar147 = vmovdqa64_avx512f(local_780);
                        }
                        uVar36 = vptestmd_avx512f(auVar147,auVar147);
                        if ((short)uVar36 == 0) goto LAB_01bf5cc3;
                        iVar1 = *(int *)(local_848.hit + 4);
                        iVar2 = *(int *)(local_848.hit + 8);
                        iVar66 = *(int *)(local_848.hit + 0xc);
                        iVar67 = *(int *)(local_848.hit + 0x10);
                        iVar68 = *(int *)(local_848.hit + 0x14);
                        iVar69 = *(int *)(local_848.hit + 0x18);
                        iVar70 = *(int *)(local_848.hit + 0x1c);
                        iVar71 = *(int *)(local_848.hit + 0x20);
                        iVar72 = *(int *)(local_848.hit + 0x24);
                        iVar73 = *(int *)(local_848.hit + 0x28);
                        iVar74 = *(int *)(local_848.hit + 0x2c);
                        iVar75 = *(int *)(local_848.hit + 0x30);
                        iVar76 = *(int *)(local_848.hit + 0x34);
                        iVar77 = *(int *)(local_848.hit + 0x38);
                        iVar78 = *(int *)(local_848.hit + 0x3c);
                        bVar91 = (byte)uVar36;
                        bVar14 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar36 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar36 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar36 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar36 >> 6) & 1);
                        bVar20 = (bool)((byte)(uVar36 >> 7) & 1);
                        bVar82 = (byte)(uVar36 >> 8);
                        bVar21 = (bool)((byte)(uVar36 >> 9) & 1);
                        bVar22 = (bool)((byte)(uVar36 >> 10) & 1);
                        bVar23 = (bool)((byte)(uVar36 >> 0xb) & 1);
                        bVar24 = (bool)((byte)(uVar36 >> 0xc) & 1);
                        bVar25 = (bool)((byte)(uVar36 >> 0xd) & 1);
                        bVar26 = (bool)((byte)(uVar36 >> 0xe) & 1);
                        bVar27 = SUB81(uVar36 >> 0xf,0);
                        *(uint *)(local_848.ray + 0x300) =
                             (uint)(bVar91 & 1) * *(int *)local_848.hit |
                             (uint)!(bool)(bVar91 & 1) * *(int *)(local_848.ray + 0x300);
                        *(uint *)(local_848.ray + 0x304) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_848.ray + 0x304);
                        *(uint *)(local_848.ray + 0x308) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_848.ray + 0x308);
                        *(uint *)(local_848.ray + 0x30c) =
                             (uint)bVar16 * iVar66 | (uint)!bVar16 * *(int *)(local_848.ray + 0x30c)
                        ;
                        *(uint *)(local_848.ray + 0x310) =
                             (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_848.ray + 0x310)
                        ;
                        *(uint *)(local_848.ray + 0x314) =
                             (uint)bVar18 * iVar68 | (uint)!bVar18 * *(int *)(local_848.ray + 0x314)
                        ;
                        *(uint *)(local_848.ray + 0x318) =
                             (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_848.ray + 0x318)
                        ;
                        *(uint *)(local_848.ray + 0x31c) =
                             (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_848.ray + 0x31c)
                        ;
                        *(uint *)(local_848.ray + 800) =
                             (uint)(bVar82 & 1) * iVar71 |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_848.ray + 800);
                        *(uint *)(local_848.ray + 0x324) =
                             (uint)bVar21 * iVar72 | (uint)!bVar21 * *(int *)(local_848.ray + 0x324)
                        ;
                        *(uint *)(local_848.ray + 0x328) =
                             (uint)bVar22 * iVar73 | (uint)!bVar22 * *(int *)(local_848.ray + 0x328)
                        ;
                        *(uint *)(local_848.ray + 0x32c) =
                             (uint)bVar23 * iVar74 | (uint)!bVar23 * *(int *)(local_848.ray + 0x32c)
                        ;
                        *(uint *)(local_848.ray + 0x330) =
                             (uint)bVar24 * iVar75 | (uint)!bVar24 * *(int *)(local_848.ray + 0x330)
                        ;
                        *(uint *)(local_848.ray + 0x334) =
                             (uint)bVar25 * iVar76 | (uint)!bVar25 * *(int *)(local_848.ray + 0x334)
                        ;
                        *(uint *)(local_848.ray + 0x338) =
                             (uint)bVar26 * iVar77 | (uint)!bVar26 * *(int *)(local_848.ray + 0x338)
                        ;
                        *(uint *)(local_848.ray + 0x33c) =
                             (uint)bVar27 * iVar78 | (uint)!bVar27 * *(int *)(local_848.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_848.hit + 0x44);
                        iVar2 = *(int *)(local_848.hit + 0x48);
                        iVar66 = *(int *)(local_848.hit + 0x4c);
                        iVar67 = *(int *)(local_848.hit + 0x50);
                        iVar68 = *(int *)(local_848.hit + 0x54);
                        iVar69 = *(int *)(local_848.hit + 0x58);
                        iVar70 = *(int *)(local_848.hit + 0x5c);
                        iVar71 = *(int *)(local_848.hit + 0x60);
                        iVar72 = *(int *)(local_848.hit + 100);
                        iVar73 = *(int *)(local_848.hit + 0x68);
                        iVar74 = *(int *)(local_848.hit + 0x6c);
                        iVar75 = *(int *)(local_848.hit + 0x70);
                        iVar76 = *(int *)(local_848.hit + 0x74);
                        iVar77 = *(int *)(local_848.hit + 0x78);
                        iVar78 = *(int *)(local_848.hit + 0x7c);
                        bVar14 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar36 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar36 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar36 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar36 >> 6) & 1);
                        bVar20 = (bool)((byte)(uVar36 >> 7) & 1);
                        bVar21 = (bool)((byte)(uVar36 >> 9) & 1);
                        bVar22 = (bool)((byte)(uVar36 >> 10) & 1);
                        bVar23 = (bool)((byte)(uVar36 >> 0xb) & 1);
                        bVar24 = (bool)((byte)(uVar36 >> 0xc) & 1);
                        bVar25 = (bool)((byte)(uVar36 >> 0xd) & 1);
                        bVar26 = (bool)((byte)(uVar36 >> 0xe) & 1);
                        bVar27 = SUB81(uVar36 >> 0xf,0);
                        *(uint *)(local_848.ray + 0x340) =
                             (uint)(bVar91 & 1) * *(int *)(local_848.hit + 0x40) |
                             (uint)!(bool)(bVar91 & 1) * *(int *)(local_848.ray + 0x340);
                        *(uint *)(local_848.ray + 0x344) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_848.ray + 0x344);
                        *(uint *)(local_848.ray + 0x348) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_848.ray + 0x348);
                        *(uint *)(local_848.ray + 0x34c) =
                             (uint)bVar16 * iVar66 | (uint)!bVar16 * *(int *)(local_848.ray + 0x34c)
                        ;
                        *(uint *)(local_848.ray + 0x350) =
                             (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_848.ray + 0x350)
                        ;
                        *(uint *)(local_848.ray + 0x354) =
                             (uint)bVar18 * iVar68 | (uint)!bVar18 * *(int *)(local_848.ray + 0x354)
                        ;
                        *(uint *)(local_848.ray + 0x358) =
                             (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_848.ray + 0x358)
                        ;
                        *(uint *)(local_848.ray + 0x35c) =
                             (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_848.ray + 0x35c)
                        ;
                        *(uint *)(local_848.ray + 0x360) =
                             (uint)(bVar82 & 1) * iVar71 |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_848.ray + 0x360);
                        *(uint *)(local_848.ray + 0x364) =
                             (uint)bVar21 * iVar72 | (uint)!bVar21 * *(int *)(local_848.ray + 0x364)
                        ;
                        *(uint *)(local_848.ray + 0x368) =
                             (uint)bVar22 * iVar73 | (uint)!bVar22 * *(int *)(local_848.ray + 0x368)
                        ;
                        *(uint *)(local_848.ray + 0x36c) =
                             (uint)bVar23 * iVar74 | (uint)!bVar23 * *(int *)(local_848.ray + 0x36c)
                        ;
                        *(uint *)(local_848.ray + 0x370) =
                             (uint)bVar24 * iVar75 | (uint)!bVar24 * *(int *)(local_848.ray + 0x370)
                        ;
                        *(uint *)(local_848.ray + 0x374) =
                             (uint)bVar25 * iVar76 | (uint)!bVar25 * *(int *)(local_848.ray + 0x374)
                        ;
                        *(uint *)(local_848.ray + 0x378) =
                             (uint)bVar26 * iVar77 | (uint)!bVar26 * *(int *)(local_848.ray + 0x378)
                        ;
                        *(uint *)(local_848.ray + 0x37c) =
                             (uint)bVar27 * iVar78 | (uint)!bVar27 * *(int *)(local_848.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_848.hit + 0x84);
                        iVar2 = *(int *)(local_848.hit + 0x88);
                        iVar66 = *(int *)(local_848.hit + 0x8c);
                        iVar67 = *(int *)(local_848.hit + 0x90);
                        iVar68 = *(int *)(local_848.hit + 0x94);
                        iVar69 = *(int *)(local_848.hit + 0x98);
                        iVar70 = *(int *)(local_848.hit + 0x9c);
                        iVar71 = *(int *)(local_848.hit + 0xa0);
                        iVar72 = *(int *)(local_848.hit + 0xa4);
                        iVar73 = *(int *)(local_848.hit + 0xa8);
                        iVar74 = *(int *)(local_848.hit + 0xac);
                        iVar75 = *(int *)(local_848.hit + 0xb0);
                        iVar76 = *(int *)(local_848.hit + 0xb4);
                        iVar77 = *(int *)(local_848.hit + 0xb8);
                        iVar78 = *(int *)(local_848.hit + 0xbc);
                        bVar14 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar36 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar36 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar36 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar36 >> 6) & 1);
                        bVar20 = (bool)((byte)(uVar36 >> 7) & 1);
                        bVar21 = (bool)((byte)(uVar36 >> 9) & 1);
                        bVar22 = (bool)((byte)(uVar36 >> 10) & 1);
                        bVar23 = (bool)((byte)(uVar36 >> 0xb) & 1);
                        bVar24 = (bool)((byte)(uVar36 >> 0xc) & 1);
                        bVar25 = (bool)((byte)(uVar36 >> 0xd) & 1);
                        bVar26 = (bool)((byte)(uVar36 >> 0xe) & 1);
                        bVar27 = SUB81(uVar36 >> 0xf,0);
                        *(uint *)(local_848.ray + 0x380) =
                             (uint)(bVar91 & 1) * *(int *)(local_848.hit + 0x80) |
                             (uint)!(bool)(bVar91 & 1) * *(int *)(local_848.ray + 0x380);
                        *(uint *)(local_848.ray + 900) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_848.ray + 900);
                        *(uint *)(local_848.ray + 0x388) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_848.ray + 0x388);
                        *(uint *)(local_848.ray + 0x38c) =
                             (uint)bVar16 * iVar66 | (uint)!bVar16 * *(int *)(local_848.ray + 0x38c)
                        ;
                        *(uint *)(local_848.ray + 0x390) =
                             (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_848.ray + 0x390)
                        ;
                        *(uint *)(local_848.ray + 0x394) =
                             (uint)bVar18 * iVar68 | (uint)!bVar18 * *(int *)(local_848.ray + 0x394)
                        ;
                        *(uint *)(local_848.ray + 0x398) =
                             (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_848.ray + 0x398)
                        ;
                        *(uint *)(local_848.ray + 0x39c) =
                             (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_848.ray + 0x39c)
                        ;
                        *(uint *)(local_848.ray + 0x3a0) =
                             (uint)(bVar82 & 1) * iVar71 |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_848.ray + 0x3a0);
                        *(uint *)(local_848.ray + 0x3a4) =
                             (uint)bVar21 * iVar72 | (uint)!bVar21 * *(int *)(local_848.ray + 0x3a4)
                        ;
                        *(uint *)(local_848.ray + 0x3a8) =
                             (uint)bVar22 * iVar73 | (uint)!bVar22 * *(int *)(local_848.ray + 0x3a8)
                        ;
                        *(uint *)(local_848.ray + 0x3ac) =
                             (uint)bVar23 * iVar74 | (uint)!bVar23 * *(int *)(local_848.ray + 0x3ac)
                        ;
                        *(uint *)(local_848.ray + 0x3b0) =
                             (uint)bVar24 * iVar75 | (uint)!bVar24 * *(int *)(local_848.ray + 0x3b0)
                        ;
                        *(uint *)(local_848.ray + 0x3b4) =
                             (uint)bVar25 * iVar76 | (uint)!bVar25 * *(int *)(local_848.ray + 0x3b4)
                        ;
                        *(uint *)(local_848.ray + 0x3b8) =
                             (uint)bVar26 * iVar77 | (uint)!bVar26 * *(int *)(local_848.ray + 0x3b8)
                        ;
                        *(uint *)(local_848.ray + 0x3bc) =
                             (uint)bVar27 * iVar78 | (uint)!bVar27 * *(int *)(local_848.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_848.hit + 0xc4);
                        iVar2 = *(int *)(local_848.hit + 200);
                        iVar66 = *(int *)(local_848.hit + 0xcc);
                        iVar67 = *(int *)(local_848.hit + 0xd0);
                        iVar68 = *(int *)(local_848.hit + 0xd4);
                        iVar69 = *(int *)(local_848.hit + 0xd8);
                        iVar70 = *(int *)(local_848.hit + 0xdc);
                        iVar71 = *(int *)(local_848.hit + 0xe0);
                        iVar72 = *(int *)(local_848.hit + 0xe4);
                        iVar73 = *(int *)(local_848.hit + 0xe8);
                        iVar74 = *(int *)(local_848.hit + 0xec);
                        iVar75 = *(int *)(local_848.hit + 0xf0);
                        iVar76 = *(int *)(local_848.hit + 0xf4);
                        iVar77 = *(int *)(local_848.hit + 0xf8);
                        iVar78 = *(int *)(local_848.hit + 0xfc);
                        bVar14 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar36 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar36 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar36 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar36 >> 6) & 1);
                        bVar20 = (bool)((byte)(uVar36 >> 7) & 1);
                        bVar21 = (bool)((byte)(uVar36 >> 9) & 1);
                        bVar22 = (bool)((byte)(uVar36 >> 10) & 1);
                        bVar23 = (bool)((byte)(uVar36 >> 0xb) & 1);
                        bVar24 = (bool)((byte)(uVar36 >> 0xc) & 1);
                        bVar25 = (bool)((byte)(uVar36 >> 0xd) & 1);
                        bVar26 = (bool)((byte)(uVar36 >> 0xe) & 1);
                        bVar27 = SUB81(uVar36 >> 0xf,0);
                        *(uint *)(local_848.ray + 0x3c0) =
                             (uint)(bVar91 & 1) * *(int *)(local_848.hit + 0xc0) |
                             (uint)!(bool)(bVar91 & 1) * *(int *)(local_848.ray + 0x3c0);
                        *(uint *)(local_848.ray + 0x3c4) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_848.ray + 0x3c4);
                        *(uint *)(local_848.ray + 0x3c8) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_848.ray + 0x3c8);
                        *(uint *)(local_848.ray + 0x3cc) =
                             (uint)bVar16 * iVar66 | (uint)!bVar16 * *(int *)(local_848.ray + 0x3cc)
                        ;
                        *(uint *)(local_848.ray + 0x3d0) =
                             (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_848.ray + 0x3d0)
                        ;
                        *(uint *)(local_848.ray + 0x3d4) =
                             (uint)bVar18 * iVar68 | (uint)!bVar18 * *(int *)(local_848.ray + 0x3d4)
                        ;
                        *(uint *)(local_848.ray + 0x3d8) =
                             (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_848.ray + 0x3d8)
                        ;
                        *(uint *)(local_848.ray + 0x3dc) =
                             (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_848.ray + 0x3dc)
                        ;
                        *(uint *)(local_848.ray + 0x3e0) =
                             (uint)(bVar82 & 1) * iVar71 |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_848.ray + 0x3e0);
                        *(uint *)(local_848.ray + 0x3e4) =
                             (uint)bVar21 * iVar72 | (uint)!bVar21 * *(int *)(local_848.ray + 0x3e4)
                        ;
                        *(uint *)(local_848.ray + 1000) =
                             (uint)bVar22 * iVar73 | (uint)!bVar22 * *(int *)(local_848.ray + 1000);
                        *(uint *)(local_848.ray + 0x3ec) =
                             (uint)bVar23 * iVar74 | (uint)!bVar23 * *(int *)(local_848.ray + 0x3ec)
                        ;
                        *(uint *)(local_848.ray + 0x3f0) =
                             (uint)bVar24 * iVar75 | (uint)!bVar24 * *(int *)(local_848.ray + 0x3f0)
                        ;
                        *(uint *)(local_848.ray + 0x3f4) =
                             (uint)bVar25 * iVar76 | (uint)!bVar25 * *(int *)(local_848.ray + 0x3f4)
                        ;
                        *(uint *)(local_848.ray + 0x3f8) =
                             (uint)bVar26 * iVar77 | (uint)!bVar26 * *(int *)(local_848.ray + 0x3f8)
                        ;
                        *(uint *)(local_848.ray + 0x3fc) =
                             (uint)bVar27 * iVar78 | (uint)!bVar27 * *(int *)(local_848.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_848.hit + 0x104);
                        iVar2 = *(int *)(local_848.hit + 0x108);
                        iVar66 = *(int *)(local_848.hit + 0x10c);
                        iVar67 = *(int *)(local_848.hit + 0x110);
                        iVar68 = *(int *)(local_848.hit + 0x114);
                        iVar69 = *(int *)(local_848.hit + 0x118);
                        iVar70 = *(int *)(local_848.hit + 0x11c);
                        iVar71 = *(int *)(local_848.hit + 0x120);
                        iVar72 = *(int *)(local_848.hit + 0x124);
                        iVar73 = *(int *)(local_848.hit + 0x128);
                        iVar74 = *(int *)(local_848.hit + 300);
                        iVar75 = *(int *)(local_848.hit + 0x130);
                        iVar76 = *(int *)(local_848.hit + 0x134);
                        iVar77 = *(int *)(local_848.hit + 0x138);
                        iVar78 = *(int *)(local_848.hit + 0x13c);
                        bVar14 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar16 = (bool)((byte)(uVar36 >> 3) & 1);
                        bVar17 = (bool)((byte)(uVar36 >> 4) & 1);
                        bVar18 = (bool)((byte)(uVar36 >> 5) & 1);
                        bVar19 = (bool)((byte)(uVar36 >> 6) & 1);
                        bVar20 = (bool)((byte)(uVar36 >> 7) & 1);
                        bVar21 = (bool)((byte)(uVar36 >> 9) & 1);
                        bVar22 = (bool)((byte)(uVar36 >> 10) & 1);
                        bVar23 = (bool)((byte)(uVar36 >> 0xb) & 1);
                        bVar24 = (bool)((byte)(uVar36 >> 0xc) & 1);
                        bVar25 = (bool)((byte)(uVar36 >> 0xd) & 1);
                        bVar26 = (bool)((byte)(uVar36 >> 0xe) & 1);
                        bVar27 = SUB81(uVar36 >> 0xf,0);
                        *(uint *)(local_848.ray + 0x400) =
                             (uint)(bVar91 & 1) * *(int *)(local_848.hit + 0x100) |
                             (uint)!(bool)(bVar91 & 1) * *(int *)(local_848.ray + 0x400);
                        *(uint *)(local_848.ray + 0x404) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_848.ray + 0x404);
                        *(uint *)(local_848.ray + 0x408) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_848.ray + 0x408);
                        *(uint *)(local_848.ray + 0x40c) =
                             (uint)bVar16 * iVar66 | (uint)!bVar16 * *(int *)(local_848.ray + 0x40c)
                        ;
                        *(uint *)(local_848.ray + 0x410) =
                             (uint)bVar17 * iVar67 | (uint)!bVar17 * *(int *)(local_848.ray + 0x410)
                        ;
                        *(uint *)(local_848.ray + 0x414) =
                             (uint)bVar18 * iVar68 | (uint)!bVar18 * *(int *)(local_848.ray + 0x414)
                        ;
                        *(uint *)(local_848.ray + 0x418) =
                             (uint)bVar19 * iVar69 | (uint)!bVar19 * *(int *)(local_848.ray + 0x418)
                        ;
                        *(uint *)(local_848.ray + 0x41c) =
                             (uint)bVar20 * iVar70 | (uint)!bVar20 * *(int *)(local_848.ray + 0x41c)
                        ;
                        *(uint *)(local_848.ray + 0x420) =
                             (uint)(bVar82 & 1) * iVar71 |
                             (uint)!(bool)(bVar82 & 1) * *(int *)(local_848.ray + 0x420);
                        *(uint *)(local_848.ray + 0x424) =
                             (uint)bVar21 * iVar72 | (uint)!bVar21 * *(int *)(local_848.ray + 0x424)
                        ;
                        *(uint *)(local_848.ray + 0x428) =
                             (uint)bVar22 * iVar73 | (uint)!bVar22 * *(int *)(local_848.ray + 0x428)
                        ;
                        *(uint *)(local_848.ray + 0x42c) =
                             (uint)bVar23 * iVar74 | (uint)!bVar23 * *(int *)(local_848.ray + 0x42c)
                        ;
                        *(uint *)(local_848.ray + 0x430) =
                             (uint)bVar24 * iVar75 | (uint)!bVar24 * *(int *)(local_848.ray + 0x430)
                        ;
                        *(uint *)(local_848.ray + 0x434) =
                             (uint)bVar25 * iVar76 | (uint)!bVar25 * *(int *)(local_848.ray + 0x434)
                        ;
                        *(uint *)(local_848.ray + 0x438) =
                             (uint)bVar26 * iVar77 | (uint)!bVar26 * *(int *)(local_848.ray + 0x438)
                        ;
                        *(uint *)(local_848.ray + 0x43c) =
                             (uint)bVar27 * iVar78 | (uint)!bVar27 * *(int *)(local_848.ray + 0x43c)
                        ;
                        auVar244 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x140));
                        auVar244 = vmovdqu32_avx512f(auVar244);
                        *(undefined1 (*) [64])(local_848.ray + 0x440) = auVar244;
                        auVar244 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x180));
                        auVar244 = vmovdqu32_avx512f(auVar244);
                        *(undefined1 (*) [64])(local_848.ray + 0x480) = auVar244;
                        auVar244 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x1c0));
                        auVar244 = vmovdqa32_avx512f(auVar244);
                        *(undefined1 (*) [64])(local_848.ray + 0x4c0) = auVar244;
                        auVar244 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x200));
                        auVar244 = vmovdqa32_avx512f(auVar244);
                        *(undefined1 (*) [64])(local_848.ray + 0x500) = auVar244;
                        auVar244 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
                      }
                      bVar91 = ~(byte)(1 << ((uint)uVar83 & 0x1f)) & (byte)uVar92;
                      uVar157 = auVar244._0_4_;
                      auVar171._4_4_ = uVar157;
                      auVar171._0_4_ = uVar157;
                      auVar171._8_4_ = uVar157;
                      auVar171._12_4_ = uVar157;
                      auVar171._16_4_ = uVar157;
                      auVar171._20_4_ = uVar157;
                      auVar171._24_4_ = uVar157;
                      auVar171._28_4_ = uVar157;
                      uVar178 = vcmpps_avx512vl(auVar227._0_32_,auVar171,2);
                      if ((bVar91 & (byte)uVar178) == 0) goto LAB_01bf4bec;
                      bVar91 = bVar91 & (byte)uVar178;
                      uVar92 = (ulong)bVar91;
                      auVar172._8_4_ = 0x7f800000;
                      auVar172._0_8_ = 0x7f8000007f800000;
                      auVar172._12_4_ = 0x7f800000;
                      auVar172._16_4_ = 0x7f800000;
                      auVar172._20_4_ = 0x7f800000;
                      auVar172._24_4_ = 0x7f800000;
                      auVar172._28_4_ = 0x7f800000;
                      auVar121 = vblendmps_avx512vl(auVar172,auVar227._0_32_);
                      auVar146._0_4_ =
                           (uint)(bVar91 & 1) * auVar121._0_4_ |
                           (uint)!(bool)(bVar91 & 1) * 0x7f800000;
                      bVar14 = (bool)(bVar91 >> 1 & 1);
                      auVar146._4_4_ = (uint)bVar14 * auVar121._4_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar91 >> 2 & 1);
                      auVar146._8_4_ = (uint)bVar14 * auVar121._8_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar91 >> 3 & 1);
                      auVar146._12_4_ = (uint)bVar14 * auVar121._12_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar91 >> 4 & 1);
                      auVar146._16_4_ = (uint)bVar14 * auVar121._16_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar91 >> 5 & 1);
                      auVar146._20_4_ = (uint)bVar14 * auVar121._20_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar91 >> 6 & 1);
                      auVar146._24_4_ = (uint)bVar14 * auVar121._24_4_ | (uint)!bVar14 * 0x7f800000;
                      auVar146._28_4_ =
                           (uint)(bVar91 >> 7) * auVar121._28_4_ |
                           (uint)!(bool)(bVar91 >> 7) * 0x7f800000;
                      auVar121 = vshufps_avx(auVar146,auVar146,0xb1);
                      auVar121 = vminps_avx(auVar146,auVar121);
                      auVar122 = vshufpd_avx(auVar121,auVar121,5);
                      auVar121 = vminps_avx(auVar121,auVar122);
                      auVar122 = vpermpd_avx2(auVar121,0x4e);
                      auVar121 = vminps_avx(auVar121,auVar122);
                      uVar178 = vcmpps_avx512vl(auVar146,auVar121,0);
                      bVar82 = (byte)uVar178 & bVar91;
                      if (bVar82 != 0) {
                        bVar91 = bVar82;
                      }
                      uVar84 = 0;
                      for (uVar85 = (uint)bVar91; (uVar85 & 1) == 0;
                          uVar85 = uVar85 >> 1 | 0x80000000) {
                        uVar84 = uVar84 + 1;
                      }
                      uVar83 = (ulong)uVar84;
                    } while( true );
                  }
                  fVar185 = local_580[uVar83];
                  uVar157 = *(undefined4 *)(local_560 + uVar83 * 4);
                  fVar230 = 1.0 - fVar185;
                  fVar229 = fVar230 * fVar230 * -3.0;
                  auVar214 = ZEXT464((uint)fVar229);
                  auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar230 * fVar230)),
                                            ZEXT416((uint)(fVar185 * fVar230)),ZEXT416(0xc0000000));
                  auVar96 = vfmsub132ss_fma(ZEXT416((uint)(fVar185 * fVar230)),
                                            ZEXT416((uint)(fVar185 * fVar185)),ZEXT416(0x40000000));
                  fVar230 = auVar95._0_4_ * 3.0;
                  fVar177 = auVar96._0_4_ * 3.0;
                  fVar184 = fVar185 * fVar185 * 3.0;
                  auVar218._0_4_ = fVar184 * fVar174;
                  auVar218._4_4_ = fVar184 * fVar175;
                  auVar218._8_4_ = fVar184 * fVar176;
                  auVar218._12_4_ = fVar184 * fVar80;
                  auVar222 = ZEXT1664(auVar218);
                  auVar191._4_4_ = fVar177;
                  auVar191._0_4_ = fVar177;
                  auVar191._8_4_ = fVar177;
                  auVar191._12_4_ = fVar177;
                  auVar95 = vfmadd132ps_fma(auVar191,auVar218,auVar102);
                  auVar201._4_4_ = fVar230;
                  auVar201._0_4_ = fVar230;
                  auVar201._8_4_ = fVar230;
                  auVar201._12_4_ = fVar230;
                  auVar95 = vfmadd132ps_fma(auVar201,auVar95,auVar101);
                  auVar192._4_4_ = fVar229;
                  auVar192._0_4_ = fVar229;
                  auVar192._8_4_ = fVar229;
                  auVar192._12_4_ = fVar229;
                  auVar95 = vfmadd132ps_fma(auVar192,auVar95,auVar28);
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_540 + uVar83 * 4);
                  *(int *)(ray + k * 4 + 0x300) = auVar95._0_4_;
                  uVar9 = vextractps_avx(auVar95,1);
                  *(undefined4 *)(ray + k * 4 + 0x340) = uVar9;
                  uVar9 = vextractps_avx(auVar95,2);
                  *(undefined4 *)(ray + k * 4 + 0x380) = uVar9;
                  *(float *)(ray + k * 4 + 0x3c0) = fVar185;
                  *(undefined4 *)(ray + k * 4 + 0x400) = uVar157;
                  *(uint *)(ray + k * 4 + 0x440) = uVar7;
                  *(uint *)(ray + k * 4 + 0x480) = uVar89;
                  *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01bf4bec:
      auVar244 = local_400;
      if (8 < iVar8) {
        local_7c0 = vpbroadcastd_avx512vl();
        local_400._4_4_ = local_7e0._0_4_;
        local_400._0_4_ = local_7e0._0_4_;
        local_400._8_4_ = local_7e0._0_4_;
        local_400._12_4_ = local_7e0._0_4_;
        local_400._16_4_ = local_7e0._0_4_;
        local_400._20_4_ = local_7e0._0_4_;
        local_400._24_4_ = local_7e0._0_4_;
        local_400._32_32_ = auVar244._32_32_;
        local_400._28_4_ = local_7e0._0_4_;
        uStack_79c = local_7a0;
        uStack_798 = local_7a0;
        uStack_794 = local_7a0;
        uStack_790 = local_7a0;
        uStack_78c = local_7a0;
        uStack_788 = local_7a0;
        uStack_784 = local_7a0;
        local_3a0 = 1.0 / (float)local_480._0_4_;
        fStack_39c = local_3a0;
        fStack_398 = local_3a0;
        fStack_394 = local_3a0;
        fStack_390 = local_3a0;
        fStack_38c = local_3a0;
        fStack_388 = local_3a0;
        fStack_384 = local_3a0;
        auVar244 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar244);
        auVar244 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar244);
        lVar87 = 8;
LAB_01bf4ca3:
        auVar121 = vpbroadcastd_avx512vl();
        auVar121 = vpor_avx2(auVar121,_DAT_01fe9900);
        uVar35 = vpcmpd_avx512vl(auVar121,local_7c0,1);
        auVar121 = *(undefined1 (*) [32])(bezier_basis0 + lVar87 * 4 + lVar37);
        auVar122 = *(undefined1 (*) [32])(lVar37 + 0x21aa768 + lVar87 * 4);
        auVar120 = *(undefined1 (*) [32])(lVar37 + 0x21aabec + lVar87 * 4);
        auVar119 = *(undefined1 (*) [32])(lVar37 + 0x21ab070 + lVar87 * 4);
        auVar244._0_4_ = auVar119._0_4_ * (float)local_720._0_4_;
        auVar244._4_4_ = auVar119._4_4_ * (float)local_720._4_4_;
        auVar244._8_4_ = auVar119._8_4_ * fStack_718;
        auVar244._12_4_ = auVar119._12_4_ * fStack_714;
        auVar244._16_4_ = auVar119._16_4_ * fStack_710;
        auVar244._20_4_ = auVar119._20_4_ * fStack_70c;
        auVar244._28_36_ = auVar222._28_36_;
        auVar244._24_4_ = auVar119._24_4_ * fStack_708;
        auVar222._0_4_ = auVar119._0_4_ * (float)local_740._0_4_;
        auVar222._4_4_ = auVar119._4_4_ * (float)local_740._4_4_;
        auVar222._8_4_ = auVar119._8_4_ * fStack_738;
        auVar222._12_4_ = auVar119._12_4_ * fStack_734;
        auVar222._16_4_ = auVar119._16_4_ * fStack_730;
        auVar222._20_4_ = auVar119._20_4_ * fStack_72c;
        auVar222._28_36_ = auVar214._28_36_;
        auVar222._24_4_ = auVar119._24_4_ * fStack_728;
        auVar107 = vmulps_avx512vl(local_380,auVar119);
        auVar108 = vfmadd231ps_avx512vl(auVar244._0_32_,auVar120,local_6e0);
        auVar118 = vfmadd231ps_avx512vl(auVar222._0_32_,auVar120,local_700);
        auVar107 = vfmadd231ps_avx512vl(auVar107,auVar120,local_360);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar122,local_6a0);
        auVar118 = vfmadd231ps_avx512vl(auVar118,auVar122,local_6c0);
        auVar109 = vfmadd231ps_avx512vl(auVar107,auVar122,local_340);
        auVar95 = vfmadd231ps_fma(auVar108,auVar121,local_660);
        auVar222 = ZEXT1664(auVar95);
        auVar96 = vfmadd231ps_fma(auVar118,auVar121,local_680);
        auVar214 = ZEXT1664(auVar96);
        auVar107 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 * 4 + lVar37);
        auVar108 = *(undefined1 (*) [32])(lVar37 + 0x21acb88 + lVar87 * 4);
        auVar112 = vfmadd231ps_avx512vl(auVar109,auVar121,local_320);
        auVar118 = *(undefined1 (*) [32])(lVar37 + 0x21ad00c + lVar87 * 4);
        auVar109 = *(undefined1 (*) [32])(lVar37 + 0x21ad490 + lVar87 * 4);
        auVar147._0_4_ = auVar109._0_4_ * (float)local_720._0_4_;
        auVar147._4_4_ = auVar109._4_4_ * (float)local_720._4_4_;
        auVar147._8_4_ = auVar109._8_4_ * fStack_718;
        auVar147._12_4_ = auVar109._12_4_ * fStack_714;
        auVar147._16_4_ = auVar109._16_4_ * fStack_710;
        auVar147._20_4_ = auVar109._20_4_ * fStack_70c;
        auVar147._28_36_ = auVar227._28_36_;
        auVar147._24_4_ = auVar109._24_4_ * fStack_708;
        auVar49._4_4_ = auVar109._4_4_ * (float)local_740._4_4_;
        auVar49._0_4_ = auVar109._0_4_ * (float)local_740._0_4_;
        auVar49._8_4_ = auVar109._8_4_ * fStack_738;
        auVar49._12_4_ = auVar109._12_4_ * fStack_734;
        auVar49._16_4_ = auVar109._16_4_ * fStack_730;
        auVar49._20_4_ = auVar109._20_4_ * fStack_72c;
        auVar49._24_4_ = auVar109._24_4_ * fStack_728;
        auVar49._28_4_ = uStack_724;
        auVar110 = vmulps_avx512vl(local_380,auVar109);
        auVar111 = vfmadd231ps_avx512vl(auVar147._0_32_,auVar118,local_6e0);
        auVar113 = vfmadd231ps_avx512vl(auVar49,auVar118,local_700);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar118,local_360);
        auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,local_6a0);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar108,local_6c0);
        auVar110 = vfmadd231ps_avx512vl(auVar110,auVar108,local_340);
        auVar104 = vfmadd231ps_fma(auVar111,auVar107,local_660);
        auVar227 = ZEXT1664(auVar104);
        auVar29 = vfmadd231ps_fma(auVar113,auVar107,local_680);
        auVar113 = vfmadd231ps_avx512vl(auVar110,auVar107,local_320);
        auVar114 = vmaxps_avx512vl(auVar112,auVar113);
        auVar110 = vsubps_avx(ZEXT1632(auVar104),ZEXT1632(auVar95));
        auVar111 = vsubps_avx(ZEXT1632(auVar29),ZEXT1632(auVar96));
        auVar115 = vmulps_avx512vl(ZEXT1632(auVar96),auVar110);
        auVar116 = vmulps_avx512vl(ZEXT1632(auVar95),auVar111);
        auVar115 = vsubps_avx512vl(auVar115,auVar116);
        auVar116 = vmulps_avx512vl(auVar111,auVar111);
        auVar116 = vfmadd231ps_avx512vl(auVar116,auVar110,auVar110);
        auVar114 = vmulps_avx512vl(auVar114,auVar114);
        auVar114 = vmulps_avx512vl(auVar114,auVar116);
        auVar115 = vmulps_avx512vl(auVar115,auVar115);
        uVar178 = vcmpps_avx512vl(auVar115,auVar114,2);
        bVar91 = (byte)uVar35 & (byte)uVar178;
        if (bVar91 != 0) {
          auVar109 = vmulps_avx512vl(local_500,auVar109);
          auVar118 = vfmadd213ps_avx512vl(auVar118,local_4e0,auVar109);
          auVar108 = vfmadd213ps_avx512vl(auVar108,local_4c0,auVar118);
          auVar107 = vfmadd213ps_avx512vl(auVar107,local_4a0,auVar108);
          auVar119 = vmulps_avx512vl(local_500,auVar119);
          auVar120 = vfmadd213ps_avx512vl(auVar120,local_4e0,auVar119);
          auVar122 = vfmadd213ps_avx512vl(auVar122,local_4c0,auVar120);
          auVar108 = vfmadd213ps_avx512vl(auVar121,local_4a0,auVar122);
          auVar121 = *(undefined1 (*) [32])(lVar37 + 0x21ab4f4 + lVar87 * 4);
          auVar122 = *(undefined1 (*) [32])(lVar37 + 0x21ab978 + lVar87 * 4);
          auVar120 = *(undefined1 (*) [32])(lVar37 + 0x21abdfc + lVar87 * 4);
          auVar119 = *(undefined1 (*) [32])(lVar37 + 0x21ac280 + lVar87 * 4);
          auVar118 = vmulps_avx512vl(_local_720,auVar119);
          auVar109 = vmulps_avx512vl(_local_740,auVar119);
          auVar119 = vmulps_avx512vl(local_500,auVar119);
          auVar118 = vfmadd231ps_avx512vl(auVar118,auVar120,local_6e0);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar120,local_700);
          auVar120 = vfmadd231ps_avx512vl(auVar119,local_4e0,auVar120);
          auVar119 = vfmadd231ps_avx512vl(auVar118,auVar122,local_6a0);
          auVar118 = vfmadd231ps_avx512vl(auVar109,auVar122,local_6c0);
          auVar122 = vfmadd231ps_avx512vl(auVar120,local_4c0,auVar122);
          auVar119 = vfmadd231ps_avx512vl(auVar119,auVar121,local_660);
          auVar118 = vfmadd231ps_avx512vl(auVar118,auVar121,local_680);
          auVar109 = vfmadd231ps_avx512vl(auVar122,local_4a0,auVar121);
          auVar121 = *(undefined1 (*) [32])(lVar37 + 0x21ad914 + lVar87 * 4);
          auVar122 = *(undefined1 (*) [32])(lVar37 + 0x21ae21c + lVar87 * 4);
          auVar120 = *(undefined1 (*) [32])(lVar37 + 0x21ae6a0 + lVar87 * 4);
          auVar114 = vmulps_avx512vl(_local_720,auVar120);
          auVar115 = vmulps_avx512vl(_local_740,auVar120);
          auVar120 = vmulps_avx512vl(local_500,auVar120);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar122,local_6e0);
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar122,local_700);
          auVar120 = vfmadd231ps_avx512vl(auVar120,local_4e0,auVar122);
          auVar122 = *(undefined1 (*) [32])(lVar37 + 0x21add98 + lVar87 * 4);
          auVar114 = vfmadd231ps_avx512vl(auVar114,auVar122,local_6a0);
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar122,local_6c0);
          auVar122 = vfmadd231ps_avx512vl(auVar120,local_4c0,auVar122);
          auVar120 = vfmadd231ps_avx512vl(auVar114,auVar121,local_660);
          auVar114 = vfmadd231ps_avx512vl(auVar115,auVar121,local_680);
          auVar122 = vfmadd231ps_avx512vl(auVar122,local_4a0,auVar121);
          auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar119,auVar115);
          vandps_avx512vl(auVar118,auVar115);
          auVar121 = vmaxps_avx(auVar115,auVar115);
          vandps_avx512vl(auVar109,auVar115);
          auVar121 = vmaxps_avx(auVar121,auVar115);
          uVar83 = vcmpps_avx512vl(auVar121,local_400._0_32_,1);
          bVar14 = (bool)((byte)uVar83 & 1);
          auVar134._0_4_ = (float)((uint)bVar14 * auVar110._0_4_ | (uint)!bVar14 * auVar119._0_4_);
          bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar134._4_4_ = (float)((uint)bVar14 * auVar110._4_4_ | (uint)!bVar14 * auVar119._4_4_);
          bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar134._8_4_ = (float)((uint)bVar14 * auVar110._8_4_ | (uint)!bVar14 * auVar119._8_4_);
          bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar134._12_4_ =
               (float)((uint)bVar14 * auVar110._12_4_ | (uint)!bVar14 * auVar119._12_4_);
          bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar134._16_4_ =
               (float)((uint)bVar14 * auVar110._16_4_ | (uint)!bVar14 * auVar119._16_4_);
          bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar134._20_4_ =
               (float)((uint)bVar14 * auVar110._20_4_ | (uint)!bVar14 * auVar119._20_4_);
          bVar14 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar134._24_4_ =
               (float)((uint)bVar14 * auVar110._24_4_ | (uint)!bVar14 * auVar119._24_4_);
          bVar14 = SUB81(uVar83 >> 7,0);
          auVar134._28_4_ = (uint)bVar14 * auVar110._28_4_ | (uint)!bVar14 * auVar119._28_4_;
          bVar14 = (bool)((byte)uVar83 & 1);
          auVar135._0_4_ = (float)((uint)bVar14 * auVar111._0_4_ | (uint)!bVar14 * auVar118._0_4_);
          bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar135._4_4_ = (float)((uint)bVar14 * auVar111._4_4_ | (uint)!bVar14 * auVar118._4_4_);
          bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar135._8_4_ = (float)((uint)bVar14 * auVar111._8_4_ | (uint)!bVar14 * auVar118._8_4_);
          bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar135._12_4_ =
               (float)((uint)bVar14 * auVar111._12_4_ | (uint)!bVar14 * auVar118._12_4_);
          bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar135._16_4_ =
               (float)((uint)bVar14 * auVar111._16_4_ | (uint)!bVar14 * auVar118._16_4_);
          bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar135._20_4_ =
               (float)((uint)bVar14 * auVar111._20_4_ | (uint)!bVar14 * auVar118._20_4_);
          bVar14 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar135._24_4_ =
               (float)((uint)bVar14 * auVar111._24_4_ | (uint)!bVar14 * auVar118._24_4_);
          bVar14 = SUB81(uVar83 >> 7,0);
          auVar135._28_4_ = (uint)bVar14 * auVar111._28_4_ | (uint)!bVar14 * auVar118._28_4_;
          vandps_avx512vl(auVar120,auVar115);
          vandps_avx512vl(auVar114,auVar115);
          auVar121 = vmaxps_avx(auVar135,auVar135);
          vandps_avx512vl(auVar122,auVar115);
          auVar121 = vmaxps_avx(auVar121,auVar135);
          uVar83 = vcmpps_avx512vl(auVar121,local_400._0_32_,1);
          bVar14 = (bool)((byte)uVar83 & 1);
          auVar136._0_4_ = (uint)bVar14 * auVar110._0_4_ | (uint)!bVar14 * auVar120._0_4_;
          bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar136._4_4_ = (uint)bVar14 * auVar110._4_4_ | (uint)!bVar14 * auVar120._4_4_;
          bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar136._8_4_ = (uint)bVar14 * auVar110._8_4_ | (uint)!bVar14 * auVar120._8_4_;
          bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar136._12_4_ = (uint)bVar14 * auVar110._12_4_ | (uint)!bVar14 * auVar120._12_4_;
          bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar136._16_4_ = (uint)bVar14 * auVar110._16_4_ | (uint)!bVar14 * auVar120._16_4_;
          bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar136._20_4_ = (uint)bVar14 * auVar110._20_4_ | (uint)!bVar14 * auVar120._20_4_;
          bVar14 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar136._24_4_ = (uint)bVar14 * auVar110._24_4_ | (uint)!bVar14 * auVar120._24_4_;
          bVar14 = SUB81(uVar83 >> 7,0);
          auVar136._28_4_ = (uint)bVar14 * auVar110._28_4_ | (uint)!bVar14 * auVar120._28_4_;
          bVar14 = (bool)((byte)uVar83 & 1);
          auVar137._0_4_ = (float)((uint)bVar14 * auVar111._0_4_ | (uint)!bVar14 * auVar114._0_4_);
          bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar137._4_4_ = (float)((uint)bVar14 * auVar111._4_4_ | (uint)!bVar14 * auVar114._4_4_);
          bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar137._8_4_ = (float)((uint)bVar14 * auVar111._8_4_ | (uint)!bVar14 * auVar114._8_4_);
          bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar137._12_4_ =
               (float)((uint)bVar14 * auVar111._12_4_ | (uint)!bVar14 * auVar114._12_4_);
          bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar137._16_4_ =
               (float)((uint)bVar14 * auVar111._16_4_ | (uint)!bVar14 * auVar114._16_4_);
          bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar137._20_4_ =
               (float)((uint)bVar14 * auVar111._20_4_ | (uint)!bVar14 * auVar114._20_4_);
          bVar14 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar137._24_4_ =
               (float)((uint)bVar14 * auVar111._24_4_ | (uint)!bVar14 * auVar114._24_4_);
          bVar14 = SUB81(uVar83 >> 7,0);
          auVar137._28_4_ = (uint)bVar14 * auVar111._28_4_ | (uint)!bVar14 * auVar114._28_4_;
          auVar233._8_4_ = 0x80000000;
          auVar233._0_8_ = 0x8000000080000000;
          auVar233._12_4_ = 0x80000000;
          auVar233._16_4_ = 0x80000000;
          auVar233._20_4_ = 0x80000000;
          auVar233._24_4_ = 0x80000000;
          auVar233._28_4_ = 0x80000000;
          auVar121 = vxorps_avx512vl(auVar136,auVar233);
          auVar106 = vxorps_avx512vl(auVar115._0_16_,auVar115._0_16_);
          auVar122 = vfmadd213ps_avx512vl(auVar134,auVar134,ZEXT1632(auVar106));
          auVar30 = vfmadd231ps_fma(auVar122,auVar135,auVar135);
          auVar122 = vrsqrt14ps_avx512vl(ZEXT1632(auVar30));
          auVar242._8_4_ = 0xbf000000;
          auVar242._0_8_ = 0xbf000000bf000000;
          auVar242._12_4_ = 0xbf000000;
          auVar242._16_4_ = 0xbf000000;
          auVar242._20_4_ = 0xbf000000;
          auVar242._24_4_ = 0xbf000000;
          auVar242._28_4_ = 0xbf000000;
          fVar185 = auVar122._0_4_;
          fVar229 = auVar122._4_4_;
          fVar230 = auVar122._8_4_;
          fVar177 = auVar122._12_4_;
          fVar184 = auVar122._16_4_;
          fVar197 = auVar122._20_4_;
          fVar93 = auVar122._24_4_;
          auVar50._4_4_ = fVar229 * fVar229 * fVar229 * auVar30._4_4_ * -0.5;
          auVar50._0_4_ = fVar185 * fVar185 * fVar185 * auVar30._0_4_ * -0.5;
          auVar50._8_4_ = fVar230 * fVar230 * fVar230 * auVar30._8_4_ * -0.5;
          auVar50._12_4_ = fVar177 * fVar177 * fVar177 * auVar30._12_4_ * -0.5;
          auVar50._16_4_ = fVar184 * fVar184 * fVar184 * -0.0;
          auVar50._20_4_ = fVar197 * fVar197 * fVar197 * -0.0;
          auVar50._24_4_ = fVar93 * fVar93 * fVar93 * -0.0;
          auVar50._28_4_ = auVar135._28_4_;
          auVar120 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar122 = vfmadd231ps_avx512vl(auVar50,auVar120,auVar122);
          auVar51._4_4_ = auVar135._4_4_ * auVar122._4_4_;
          auVar51._0_4_ = auVar135._0_4_ * auVar122._0_4_;
          auVar51._8_4_ = auVar135._8_4_ * auVar122._8_4_;
          auVar51._12_4_ = auVar135._12_4_ * auVar122._12_4_;
          auVar51._16_4_ = auVar135._16_4_ * auVar122._16_4_;
          auVar51._20_4_ = auVar135._20_4_ * auVar122._20_4_;
          auVar51._24_4_ = auVar135._24_4_ * auVar122._24_4_;
          auVar51._28_4_ = 0;
          auVar52._4_4_ = auVar122._4_4_ * -auVar134._4_4_;
          auVar52._0_4_ = auVar122._0_4_ * -auVar134._0_4_;
          auVar52._8_4_ = auVar122._8_4_ * -auVar134._8_4_;
          auVar52._12_4_ = auVar122._12_4_ * -auVar134._12_4_;
          auVar52._16_4_ = auVar122._16_4_ * -auVar134._16_4_;
          auVar52._20_4_ = auVar122._20_4_ * -auVar134._20_4_;
          auVar52._24_4_ = auVar122._24_4_ * -auVar134._24_4_;
          auVar52._28_4_ = auVar135._28_4_;
          auVar119 = vmulps_avx512vl(auVar122,ZEXT1632(auVar106));
          auVar109 = ZEXT1632(auVar106);
          auVar122 = vfmadd213ps_avx512vl(auVar136,auVar136,auVar109);
          auVar122 = vfmadd231ps_avx512vl(auVar122,auVar137,auVar137);
          auVar118 = vrsqrt14ps_avx512vl(auVar122);
          auVar122 = vmulps_avx512vl(auVar122,auVar242);
          fVar185 = auVar118._0_4_;
          fVar229 = auVar118._4_4_;
          fVar230 = auVar118._8_4_;
          fVar177 = auVar118._12_4_;
          fVar184 = auVar118._16_4_;
          fVar197 = auVar118._20_4_;
          fVar93 = auVar118._24_4_;
          auVar53._4_4_ = fVar229 * fVar229 * fVar229 * auVar122._4_4_;
          auVar53._0_4_ = fVar185 * fVar185 * fVar185 * auVar122._0_4_;
          auVar53._8_4_ = fVar230 * fVar230 * fVar230 * auVar122._8_4_;
          auVar53._12_4_ = fVar177 * fVar177 * fVar177 * auVar122._12_4_;
          auVar53._16_4_ = fVar184 * fVar184 * fVar184 * auVar122._16_4_;
          auVar53._20_4_ = fVar197 * fVar197 * fVar197 * auVar122._20_4_;
          auVar53._24_4_ = fVar93 * fVar93 * fVar93 * auVar122._24_4_;
          auVar53._28_4_ = auVar122._28_4_;
          auVar122 = vfmadd231ps_avx512vl(auVar53,auVar120,auVar118);
          auVar54._4_4_ = auVar137._4_4_ * auVar122._4_4_;
          auVar54._0_4_ = auVar137._0_4_ * auVar122._0_4_;
          auVar54._8_4_ = auVar137._8_4_ * auVar122._8_4_;
          auVar54._12_4_ = auVar137._12_4_ * auVar122._12_4_;
          auVar54._16_4_ = auVar137._16_4_ * auVar122._16_4_;
          auVar54._20_4_ = auVar137._20_4_ * auVar122._20_4_;
          auVar54._24_4_ = auVar137._24_4_ * auVar122._24_4_;
          auVar54._28_4_ = auVar118._28_4_;
          auVar55._4_4_ = auVar122._4_4_ * auVar121._4_4_;
          auVar55._0_4_ = auVar122._0_4_ * auVar121._0_4_;
          auVar55._8_4_ = auVar122._8_4_ * auVar121._8_4_;
          auVar55._12_4_ = auVar122._12_4_ * auVar121._12_4_;
          auVar55._16_4_ = auVar122._16_4_ * auVar121._16_4_;
          auVar55._20_4_ = auVar122._20_4_ * auVar121._20_4_;
          auVar55._24_4_ = auVar122._24_4_ * auVar121._24_4_;
          auVar55._28_4_ = auVar121._28_4_;
          auVar121 = vmulps_avx512vl(auVar122,auVar109);
          auVar30 = vfmadd213ps_fma(auVar51,auVar112,ZEXT1632(auVar95));
          auVar31 = vfmadd213ps_fma(auVar52,auVar112,ZEXT1632(auVar96));
          auVar120 = vfmadd213ps_avx512vl(auVar119,auVar112,auVar108);
          auVar118 = vfmadd213ps_avx512vl(auVar54,auVar113,ZEXT1632(auVar104));
          auVar33 = vfnmadd213ps_fma(auVar51,auVar112,ZEXT1632(auVar95));
          auVar95 = vfmadd213ps_fma(auVar55,auVar113,ZEXT1632(auVar29));
          auVar34 = vfnmadd213ps_fma(auVar52,auVar112,ZEXT1632(auVar96));
          auVar96 = vfmadd213ps_fma(auVar121,auVar113,auVar107);
          auVar245 = vfnmadd231ps_fma(auVar108,auVar112,auVar119);
          auVar100 = vfnmadd213ps_fma(auVar54,auVar113,ZEXT1632(auVar104));
          auVar103 = vfnmadd213ps_fma(auVar55,auVar113,ZEXT1632(auVar29));
          auVar105 = vfnmadd231ps_fma(auVar107,auVar113,auVar121);
          auVar107 = vsubps_avx512vl(auVar118,ZEXT1632(auVar33));
          auVar121 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar34));
          auVar122 = vsubps_avx(ZEXT1632(auVar96),ZEXT1632(auVar245));
          auVar56._4_4_ = auVar121._4_4_ * auVar245._4_4_;
          auVar56._0_4_ = auVar121._0_4_ * auVar245._0_4_;
          auVar56._8_4_ = auVar121._8_4_ * auVar245._8_4_;
          auVar56._12_4_ = auVar121._12_4_ * auVar245._12_4_;
          auVar56._16_4_ = auVar121._16_4_ * 0.0;
          auVar56._20_4_ = auVar121._20_4_ * 0.0;
          auVar56._24_4_ = auVar121._24_4_ * 0.0;
          auVar56._28_4_ = auVar119._28_4_;
          auVar104 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar34),auVar122);
          auVar57._4_4_ = auVar122._4_4_ * auVar33._4_4_;
          auVar57._0_4_ = auVar122._0_4_ * auVar33._0_4_;
          auVar57._8_4_ = auVar122._8_4_ * auVar33._8_4_;
          auVar57._12_4_ = auVar122._12_4_ * auVar33._12_4_;
          auVar57._16_4_ = auVar122._16_4_ * 0.0;
          auVar57._20_4_ = auVar122._20_4_ * 0.0;
          auVar57._24_4_ = auVar122._24_4_ * 0.0;
          auVar57._28_4_ = auVar122._28_4_;
          auVar29 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar245),auVar107);
          auVar58._4_4_ = auVar34._4_4_ * auVar107._4_4_;
          auVar58._0_4_ = auVar34._0_4_ * auVar107._0_4_;
          auVar58._8_4_ = auVar34._8_4_ * auVar107._8_4_;
          auVar58._12_4_ = auVar34._12_4_ * auVar107._12_4_;
          auVar58._16_4_ = auVar107._16_4_ * 0.0;
          auVar58._20_4_ = auVar107._20_4_ * 0.0;
          auVar58._24_4_ = auVar107._24_4_ * 0.0;
          auVar58._28_4_ = auVar107._28_4_;
          auVar32 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar33),auVar121);
          auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar32),auVar109,ZEXT1632(auVar29));
          auVar121 = vfmadd231ps_avx512vl(auVar121,auVar109,ZEXT1632(auVar104));
          auVar115 = ZEXT1632(auVar106);
          uVar83 = vcmpps_avx512vl(auVar121,auVar115,2);
          bVar82 = (byte)uVar83;
          fVar149 = (float)((uint)(bVar82 & 1) * auVar30._0_4_ |
                           (uint)!(bool)(bVar82 & 1) * auVar100._0_4_);
          bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
          fVar151 = (float)((uint)bVar14 * auVar30._4_4_ | (uint)!bVar14 * auVar100._4_4_);
          bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
          fVar154 = (float)((uint)bVar14 * auVar30._8_4_ | (uint)!bVar14 * auVar100._8_4_);
          bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
          fVar155 = (float)((uint)bVar14 * auVar30._12_4_ | (uint)!bVar14 * auVar100._12_4_);
          auVar109 = ZEXT1632(CONCAT412(fVar155,CONCAT48(fVar154,CONCAT44(fVar151,fVar149))));
          fVar150 = (float)((uint)(bVar82 & 1) * auVar31._0_4_ |
                           (uint)!(bool)(bVar82 & 1) * auVar103._0_4_);
          bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
          fVar153 = (float)((uint)bVar14 * auVar31._4_4_ | (uint)!bVar14 * auVar103._4_4_);
          bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
          fVar152 = (float)((uint)bVar14 * auVar31._8_4_ | (uint)!bVar14 * auVar103._8_4_);
          bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
          fVar156 = (float)((uint)bVar14 * auVar31._12_4_ | (uint)!bVar14 * auVar103._12_4_);
          auVar110 = ZEXT1632(CONCAT412(fVar156,CONCAT48(fVar152,CONCAT44(fVar153,fVar150))));
          auVar138._0_4_ =
               (float)((uint)(bVar82 & 1) * auVar120._0_4_ |
                      (uint)!(bool)(bVar82 & 1) * auVar105._0_4_);
          bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar138._4_4_ = (float)((uint)bVar14 * auVar120._4_4_ | (uint)!bVar14 * auVar105._4_4_);
          bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar138._8_4_ = (float)((uint)bVar14 * auVar120._8_4_ | (uint)!bVar14 * auVar105._8_4_);
          bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar138._12_4_ =
               (float)((uint)bVar14 * auVar120._12_4_ | (uint)!bVar14 * auVar105._12_4_);
          fVar229 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar120._16_4_);
          auVar138._16_4_ = fVar229;
          fVar185 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar120._20_4_);
          auVar138._20_4_ = fVar185;
          fVar230 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar120._24_4_);
          auVar138._24_4_ = fVar230;
          iVar1 = (uint)(byte)(uVar83 >> 7) * auVar120._28_4_;
          auVar138._28_4_ = iVar1;
          auVar121 = vblendmps_avx512vl(ZEXT1632(auVar33),auVar118);
          auVar139._0_4_ =
               (uint)(bVar82 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar104._0_4_;
          bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar139._4_4_ = (uint)bVar14 * auVar121._4_4_ | (uint)!bVar14 * auVar104._4_4_;
          bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar139._8_4_ = (uint)bVar14 * auVar121._8_4_ | (uint)!bVar14 * auVar104._8_4_;
          bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar139._12_4_ = (uint)bVar14 * auVar121._12_4_ | (uint)!bVar14 * auVar104._12_4_;
          auVar139._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * auVar121._16_4_;
          auVar139._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * auVar121._20_4_;
          auVar139._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * auVar121._24_4_;
          auVar139._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar121._28_4_;
          auVar121 = vblendmps_avx512vl(ZEXT1632(auVar34),ZEXT1632(auVar95));
          auVar140._0_4_ =
               (float)((uint)(bVar82 & 1) * auVar121._0_4_ |
                      (uint)!(bool)(bVar82 & 1) * auVar30._0_4_);
          bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar140._4_4_ = (float)((uint)bVar14 * auVar121._4_4_ | (uint)!bVar14 * auVar30._4_4_);
          bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar140._8_4_ = (float)((uint)bVar14 * auVar121._8_4_ | (uint)!bVar14 * auVar30._8_4_);
          bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar140._12_4_ = (float)((uint)bVar14 * auVar121._12_4_ | (uint)!bVar14 * auVar30._12_4_)
          ;
          fVar184 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar121._16_4_);
          auVar140._16_4_ = fVar184;
          fVar197 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar121._20_4_);
          auVar140._20_4_ = fVar197;
          fVar177 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar121._24_4_);
          auVar140._24_4_ = fVar177;
          auVar140._28_4_ = (uint)(byte)(uVar83 >> 7) * auVar121._28_4_;
          auVar121 = vblendmps_avx512vl(ZEXT1632(auVar245),ZEXT1632(auVar96));
          auVar141._0_4_ =
               (float)((uint)(bVar82 & 1) * auVar121._0_4_ |
                      (uint)!(bool)(bVar82 & 1) * auVar31._0_4_);
          bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar141._4_4_ = (float)((uint)bVar14 * auVar121._4_4_ | (uint)!bVar14 * auVar31._4_4_);
          bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar141._8_4_ = (float)((uint)bVar14 * auVar121._8_4_ | (uint)!bVar14 * auVar31._8_4_);
          bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar141._12_4_ = (float)((uint)bVar14 * auVar121._12_4_ | (uint)!bVar14 * auVar31._12_4_)
          ;
          fVar148 = (float)((uint)((byte)(uVar83 >> 4) & 1) * auVar121._16_4_);
          auVar141._16_4_ = fVar148;
          fVar93 = (float)((uint)((byte)(uVar83 >> 5) & 1) * auVar121._20_4_);
          auVar141._20_4_ = fVar93;
          fVar94 = (float)((uint)((byte)(uVar83 >> 6) & 1) * auVar121._24_4_);
          auVar141._24_4_ = fVar94;
          iVar2 = (uint)(byte)(uVar83 >> 7) * auVar121._28_4_;
          auVar141._28_4_ = iVar2;
          auVar142._0_4_ =
               (uint)(bVar82 & 1) * (int)auVar33._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar118._0_4_;
          bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar142._4_4_ = (uint)bVar14 * (int)auVar33._4_4_ | (uint)!bVar14 * auVar118._4_4_;
          bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar142._8_4_ = (uint)bVar14 * (int)auVar33._8_4_ | (uint)!bVar14 * auVar118._8_4_;
          bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar142._12_4_ = (uint)bVar14 * (int)auVar33._12_4_ | (uint)!bVar14 * auVar118._12_4_;
          auVar142._16_4_ = (uint)!(bool)((byte)(uVar83 >> 4) & 1) * auVar118._16_4_;
          auVar142._20_4_ = (uint)!(bool)((byte)(uVar83 >> 5) & 1) * auVar118._20_4_;
          auVar142._24_4_ = (uint)!(bool)((byte)(uVar83 >> 6) & 1) * auVar118._24_4_;
          auVar142._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar118._28_4_;
          bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar83 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar83 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar83 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar83 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar118 = vsubps_avx512vl(auVar142,auVar109);
          auVar122 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar34._12_4_ |
                                                   (uint)!bVar18 * auVar95._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar34._8_4_ |
                                                            (uint)!bVar16 * auVar95._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar34._4_4_ |
                                                                     (uint)!bVar14 * auVar95._4_4_,
                                                                     (uint)(bVar82 & 1) *
                                                                     (int)auVar34._0_4_ |
                                                                     (uint)!(bool)(bVar82 & 1) *
                                                                     auVar95._0_4_)))),auVar110);
          auVar222 = ZEXT3264(auVar122);
          auVar120 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar245._12_4_ |
                                                   (uint)!bVar19 * auVar96._12_4_,
                                                   CONCAT48((uint)bVar17 * (int)auVar245._8_4_ |
                                                            (uint)!bVar17 * auVar96._8_4_,
                                                            CONCAT44((uint)bVar15 *
                                                                     (int)auVar245._4_4_ |
                                                                     (uint)!bVar15 * auVar96._4_4_,
                                                                     (uint)(bVar82 & 1) *
                                                                     (int)auVar245._0_4_ |
                                                                     (uint)!(bool)(bVar82 & 1) *
                                                                     auVar96._0_4_)))),auVar138);
          auVar119 = vsubps_avx(auVar109,auVar139);
          auVar227 = ZEXT3264(auVar119);
          auVar107 = vsubps_avx(auVar110,auVar140);
          auVar108 = vsubps_avx(auVar138,auVar141);
          auVar59._4_4_ = auVar120._4_4_ * fVar151;
          auVar59._0_4_ = auVar120._0_4_ * fVar149;
          auVar59._8_4_ = auVar120._8_4_ * fVar154;
          auVar59._12_4_ = auVar120._12_4_ * fVar155;
          auVar59._16_4_ = auVar120._16_4_ * 0.0;
          auVar59._20_4_ = auVar120._20_4_ * 0.0;
          auVar59._24_4_ = auVar120._24_4_ * 0.0;
          auVar59._28_4_ = 0;
          auVar95 = vfmsub231ps_fma(auVar59,auVar138,auVar118);
          auVar206._0_4_ = fVar150 * auVar118._0_4_;
          auVar206._4_4_ = fVar153 * auVar118._4_4_;
          auVar206._8_4_ = fVar152 * auVar118._8_4_;
          auVar206._12_4_ = fVar156 * auVar118._12_4_;
          auVar206._16_4_ = auVar118._16_4_ * 0.0;
          auVar206._20_4_ = auVar118._20_4_ * 0.0;
          auVar206._24_4_ = auVar118._24_4_ * 0.0;
          auVar206._28_4_ = 0;
          auVar96 = vfmsub231ps_fma(auVar206,auVar109,auVar122);
          auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar115,ZEXT1632(auVar95));
          auVar212._0_4_ = auVar122._0_4_ * auVar138._0_4_;
          auVar212._4_4_ = auVar122._4_4_ * auVar138._4_4_;
          auVar212._8_4_ = auVar122._8_4_ * auVar138._8_4_;
          auVar212._12_4_ = auVar122._12_4_ * auVar138._12_4_;
          auVar212._16_4_ = auVar122._16_4_ * fVar229;
          auVar212._20_4_ = auVar122._20_4_ * fVar185;
          auVar212._24_4_ = auVar122._24_4_ * fVar230;
          auVar212._28_4_ = 0;
          auVar95 = vfmsub231ps_fma(auVar212,auVar110,auVar120);
          auVar111 = vfmadd231ps_avx512vl(auVar121,auVar115,ZEXT1632(auVar95));
          auVar121 = vmulps_avx512vl(auVar108,auVar139);
          auVar121 = vfmsub231ps_avx512vl(auVar121,auVar119,auVar141);
          auVar60._4_4_ = auVar107._4_4_ * auVar141._4_4_;
          auVar60._0_4_ = auVar107._0_4_ * auVar141._0_4_;
          auVar60._8_4_ = auVar107._8_4_ * auVar141._8_4_;
          auVar60._12_4_ = auVar107._12_4_ * auVar141._12_4_;
          auVar60._16_4_ = auVar107._16_4_ * fVar148;
          auVar60._20_4_ = auVar107._20_4_ * fVar93;
          auVar60._24_4_ = auVar107._24_4_ * fVar94;
          auVar60._28_4_ = iVar2;
          auVar95 = vfmsub231ps_fma(auVar60,auVar140,auVar108);
          auVar213._0_4_ = auVar140._0_4_ * auVar119._0_4_;
          auVar213._4_4_ = auVar140._4_4_ * auVar119._4_4_;
          auVar213._8_4_ = auVar140._8_4_ * auVar119._8_4_;
          auVar213._12_4_ = auVar140._12_4_ * auVar119._12_4_;
          auVar213._16_4_ = fVar184 * auVar119._16_4_;
          auVar213._20_4_ = fVar197 * auVar119._20_4_;
          auVar213._24_4_ = fVar177 * auVar119._24_4_;
          auVar213._28_4_ = 0;
          auVar96 = vfmsub231ps_fma(auVar213,auVar107,auVar139);
          auVar121 = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar115,auVar121);
          auVar114 = vfmadd231ps_avx512vl(auVar121,auVar115,ZEXT1632(auVar95));
          auVar214 = ZEXT3264(auVar114);
          auVar121 = vmaxps_avx(auVar111,auVar114);
          uVar178 = vcmpps_avx512vl(auVar121,auVar115,2);
          bVar91 = bVar91 & (byte)uVar178;
          if (bVar91 != 0) {
            uVar157 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar243._4_4_ = uVar157;
            auVar243._0_4_ = uVar157;
            auVar243._8_4_ = uVar157;
            auVar243._12_4_ = uVar157;
            auVar243._16_4_ = uVar157;
            auVar243._20_4_ = uVar157;
            auVar243._24_4_ = uVar157;
            auVar243._28_4_ = uVar157;
            auVar244 = ZEXT3264(auVar243);
            auVar61._4_4_ = auVar108._4_4_ * auVar122._4_4_;
            auVar61._0_4_ = auVar108._0_4_ * auVar122._0_4_;
            auVar61._8_4_ = auVar108._8_4_ * auVar122._8_4_;
            auVar61._12_4_ = auVar108._12_4_ * auVar122._12_4_;
            auVar61._16_4_ = auVar108._16_4_ * auVar122._16_4_;
            auVar61._20_4_ = auVar108._20_4_ * auVar122._20_4_;
            auVar61._24_4_ = auVar108._24_4_ * auVar122._24_4_;
            auVar61._28_4_ = auVar121._28_4_;
            auVar29 = vfmsub231ps_fma(auVar61,auVar107,auVar120);
            auVar62._4_4_ = auVar120._4_4_ * auVar119._4_4_;
            auVar62._0_4_ = auVar120._0_4_ * auVar119._0_4_;
            auVar62._8_4_ = auVar120._8_4_ * auVar119._8_4_;
            auVar62._12_4_ = auVar120._12_4_ * auVar119._12_4_;
            auVar62._16_4_ = auVar120._16_4_ * auVar119._16_4_;
            auVar62._20_4_ = auVar120._20_4_ * auVar119._20_4_;
            auVar62._24_4_ = auVar120._24_4_ * auVar119._24_4_;
            auVar62._28_4_ = auVar120._28_4_;
            auVar104 = vfmsub231ps_fma(auVar62,auVar118,auVar108);
            auVar63._4_4_ = auVar107._4_4_ * auVar118._4_4_;
            auVar63._0_4_ = auVar107._0_4_ * auVar118._0_4_;
            auVar63._8_4_ = auVar107._8_4_ * auVar118._8_4_;
            auVar63._12_4_ = auVar107._12_4_ * auVar118._12_4_;
            auVar63._16_4_ = auVar107._16_4_ * auVar118._16_4_;
            auVar63._20_4_ = auVar107._20_4_ * auVar118._20_4_;
            auVar63._24_4_ = auVar107._24_4_ * auVar118._24_4_;
            auVar63._28_4_ = auVar107._28_4_;
            auVar30 = vfmsub231ps_fma(auVar63,auVar119,auVar122);
            auVar95 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar104),ZEXT1632(auVar30));
            auVar96 = vfmadd231ps_fma(ZEXT1632(auVar95),ZEXT1632(auVar29),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar121 = vrcp14ps_avx512vl(ZEXT1632(auVar96));
            auVar41._8_4_ = 0x3f800000;
            auVar41._0_8_ = 0x3f8000003f800000;
            auVar41._12_4_ = 0x3f800000;
            auVar41._16_4_ = 0x3f800000;
            auVar41._20_4_ = 0x3f800000;
            auVar41._24_4_ = 0x3f800000;
            auVar41._28_4_ = 0x3f800000;
            auVar122 = vfnmadd213ps_avx512vl(auVar121,ZEXT1632(auVar96),auVar41);
            auVar95 = vfmadd132ps_fma(auVar122,auVar121,auVar121);
            auVar222 = ZEXT1664(auVar95);
            auVar64._4_4_ = auVar30._4_4_ * auVar138._4_4_;
            auVar64._0_4_ = auVar30._0_4_ * auVar138._0_4_;
            auVar64._8_4_ = auVar30._8_4_ * auVar138._8_4_;
            auVar64._12_4_ = auVar30._12_4_ * auVar138._12_4_;
            auVar64._16_4_ = fVar229 * 0.0;
            auVar64._20_4_ = fVar185 * 0.0;
            auVar64._24_4_ = fVar230 * 0.0;
            auVar64._28_4_ = iVar1;
            auVar104 = vfmadd231ps_fma(auVar64,auVar110,ZEXT1632(auVar104));
            auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar109,ZEXT1632(auVar29));
            fVar185 = auVar95._0_4_;
            fVar229 = auVar95._4_4_;
            fVar230 = auVar95._8_4_;
            fVar177 = auVar95._12_4_;
            local_800._28_4_ = auVar121._28_4_;
            local_800._0_28_ =
                 ZEXT1628(CONCAT412(auVar104._12_4_ * fVar177,
                                    CONCAT48(auVar104._8_4_ * fVar230,
                                             CONCAT44(auVar104._4_4_ * fVar229,
                                                      auVar104._0_4_ * fVar185))));
            auVar227 = ZEXT3264(local_800);
            uVar178 = vcmpps_avx512vl(local_800,auVar243,2);
            auVar79._4_4_ = uStack_79c;
            auVar79._0_4_ = local_7a0;
            auVar79._8_4_ = uStack_798;
            auVar79._12_4_ = uStack_794;
            auVar79._16_4_ = uStack_790;
            auVar79._20_4_ = uStack_78c;
            auVar79._24_4_ = uStack_788;
            auVar79._28_4_ = uStack_784;
            uVar35 = vcmpps_avx512vl(local_800,auVar79,0xd);
            bVar91 = (byte)uVar178 & (byte)uVar35 & bVar91;
            if (bVar91 != 0) {
              uVar92 = vcmpps_avx512vl(ZEXT1632(auVar96),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar92 = bVar91 & uVar92;
              if ((char)uVar92 != '\0') {
                fVar184 = auVar111._0_4_ * fVar185;
                fVar197 = auVar111._4_4_ * fVar229;
                auVar65._4_4_ = fVar197;
                auVar65._0_4_ = fVar184;
                fVar93 = auVar111._8_4_ * fVar230;
                auVar65._8_4_ = fVar93;
                fVar94 = auVar111._12_4_ * fVar177;
                auVar65._12_4_ = fVar94;
                fVar148 = auVar111._16_4_ * 0.0;
                auVar65._16_4_ = fVar148;
                fVar149 = auVar111._20_4_ * 0.0;
                auVar65._20_4_ = fVar149;
                fVar150 = auVar111._24_4_ * 0.0;
                auVar65._24_4_ = fVar150;
                auVar65._28_4_ = auVar111._28_4_;
                auVar196._8_4_ = 0x3f800000;
                auVar196._0_8_ = 0x3f8000003f800000;
                auVar196._12_4_ = 0x3f800000;
                auVar196._16_4_ = 0x3f800000;
                auVar196._20_4_ = 0x3f800000;
                auVar196._24_4_ = 0x3f800000;
                auVar196._28_4_ = 0x3f800000;
                auVar121 = vsubps_avx(auVar196,auVar65);
                local_640._0_4_ =
                     (float)((uint)(bVar82 & 1) * (int)fVar184 |
                            (uint)!(bool)(bVar82 & 1) * auVar121._0_4_);
                bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
                local_640._4_4_ =
                     (float)((uint)bVar14 * (int)fVar197 | (uint)!bVar14 * auVar121._4_4_);
                bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
                local_640._8_4_ =
                     (float)((uint)bVar14 * (int)fVar93 | (uint)!bVar14 * auVar121._8_4_);
                bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
                local_640._12_4_ =
                     (float)((uint)bVar14 * (int)fVar94 | (uint)!bVar14 * auVar121._12_4_);
                bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
                local_640._16_4_ =
                     (float)((uint)bVar14 * (int)fVar148 | (uint)!bVar14 * auVar121._16_4_);
                bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
                local_640._20_4_ =
                     (float)((uint)bVar14 * (int)fVar149 | (uint)!bVar14 * auVar121._20_4_);
                bVar14 = (bool)((byte)(uVar83 >> 6) & 1);
                local_640._24_4_ =
                     (float)((uint)bVar14 * (int)fVar150 | (uint)!bVar14 * auVar121._24_4_);
                bVar14 = SUB81(uVar83 >> 7,0);
                local_640._28_4_ =
                     (float)((uint)bVar14 * auVar111._28_4_ | (uint)!bVar14 * auVar121._28_4_);
                auVar121 = vsubps_avx(auVar113,auVar112);
                auVar95 = vfmadd213ps_fma(auVar121,local_640,auVar112);
                uVar157 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                auVar42._4_4_ = uVar157;
                auVar42._0_4_ = uVar157;
                auVar42._8_4_ = uVar157;
                auVar42._12_4_ = uVar157;
                auVar42._16_4_ = uVar157;
                auVar42._20_4_ = uVar157;
                auVar42._24_4_ = uVar157;
                auVar42._28_4_ = uVar157;
                auVar121 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar95._12_4_ + auVar95._12_4_,
                                                              CONCAT48(auVar95._8_4_ + auVar95._8_4_
                                                                       ,CONCAT44(auVar95._4_4_ +
                                                                                 auVar95._4_4_,
                                                                                 auVar95._0_4_ +
                                                                                 auVar95._0_4_)))),
                                           auVar42);
                uVar36 = vcmpps_avx512vl(local_800,auVar121,6);
                uVar92 = uVar92 & uVar36;
                bVar91 = (byte)uVar92;
                if (bVar91 != 0) {
                  auVar183._0_4_ = auVar114._0_4_ * fVar185;
                  auVar183._4_4_ = auVar114._4_4_ * fVar229;
                  auVar183._8_4_ = auVar114._8_4_ * fVar230;
                  auVar183._12_4_ = auVar114._12_4_ * fVar177;
                  auVar183._16_4_ = auVar114._16_4_ * 0.0;
                  auVar183._20_4_ = auVar114._20_4_ * 0.0;
                  auVar183._24_4_ = auVar114._24_4_ * 0.0;
                  auVar183._28_4_ = 0;
                  auVar207._8_4_ = 0x3f800000;
                  auVar207._0_8_ = 0x3f8000003f800000;
                  auVar207._12_4_ = 0x3f800000;
                  auVar207._16_4_ = 0x3f800000;
                  auVar207._20_4_ = 0x3f800000;
                  auVar207._24_4_ = 0x3f800000;
                  auVar207._28_4_ = 0x3f800000;
                  auVar121 = vsubps_avx(auVar207,auVar183);
                  auVar143._0_4_ =
                       (uint)(bVar82 & 1) * (int)auVar183._0_4_ |
                       (uint)!(bool)(bVar82 & 1) * auVar121._0_4_;
                  bVar14 = (bool)((byte)(uVar83 >> 1) & 1);
                  auVar143._4_4_ =
                       (uint)bVar14 * (int)auVar183._4_4_ | (uint)!bVar14 * auVar121._4_4_;
                  bVar14 = (bool)((byte)(uVar83 >> 2) & 1);
                  auVar143._8_4_ =
                       (uint)bVar14 * (int)auVar183._8_4_ | (uint)!bVar14 * auVar121._8_4_;
                  bVar14 = (bool)((byte)(uVar83 >> 3) & 1);
                  auVar143._12_4_ =
                       (uint)bVar14 * (int)auVar183._12_4_ | (uint)!bVar14 * auVar121._12_4_;
                  bVar14 = (bool)((byte)(uVar83 >> 4) & 1);
                  auVar143._16_4_ =
                       (uint)bVar14 * (int)auVar183._16_4_ | (uint)!bVar14 * auVar121._16_4_;
                  bVar14 = (bool)((byte)(uVar83 >> 5) & 1);
                  auVar143._20_4_ =
                       (uint)bVar14 * (int)auVar183._20_4_ | (uint)!bVar14 * auVar121._20_4_;
                  bVar14 = (bool)((byte)(uVar83 >> 6) & 1);
                  auVar143._24_4_ =
                       (uint)bVar14 * (int)auVar183._24_4_ | (uint)!bVar14 * auVar121._24_4_;
                  auVar143._28_4_ = (uint)!SUB81(uVar83 >> 7,0) * auVar121._28_4_;
                  auVar43._8_4_ = 0x40000000;
                  auVar43._0_8_ = 0x4000000040000000;
                  auVar43._12_4_ = 0x40000000;
                  auVar43._16_4_ = 0x40000000;
                  auVar43._20_4_ = 0x40000000;
                  auVar43._24_4_ = 0x40000000;
                  auVar43._28_4_ = 0x40000000;
                  local_620 = vfmsub132ps_avx512vl(auVar143,auVar207,auVar43);
                  local_5e0 = (undefined4)lVar87;
                  local_5d0 = local_860;
                  uStack_5c8 = uStack_858;
                  local_5c0 = local_880;
                  uStack_5b8 = uStack_878;
                  local_5b0 = local_890;
                  uStack_5a8 = uStack_888;
                  local_5a0 = local_870;
                  uStack_598 = uStack_868;
                  pGVar88 = (context->scene->geometries).items[uVar89].ptr;
                  if ((pGVar88->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    auVar95 = vcvtsi2ss_avx512f(auVar106,local_5e0);
                    fVar185 = auVar95._0_4_;
                    local_580[0] = (fVar185 + local_640._0_4_ + 0.0) * local_3a0;
                    local_580[1] = (fVar185 + local_640._4_4_ + 1.0) * fStack_39c;
                    local_580[2] = (fVar185 + local_640._8_4_ + 2.0) * fStack_398;
                    local_580[3] = (fVar185 + local_640._12_4_ + 3.0) * fStack_394;
                    fStack_570 = (fVar185 + local_640._16_4_ + 4.0) * fStack_390;
                    fStack_56c = (fVar185 + local_640._20_4_ + 5.0) * fStack_38c;
                    fStack_568 = (fVar185 + local_640._24_4_ + 6.0) * fStack_388;
                    fStack_564 = fVar185 + local_640._28_4_ + 7.0;
                    local_560 = local_620;
                    local_540 = local_800;
                    auVar168._8_4_ = 0x7f800000;
                    auVar168._0_8_ = 0x7f8000007f800000;
                    auVar168._12_4_ = 0x7f800000;
                    auVar168._16_4_ = 0x7f800000;
                    auVar168._20_4_ = 0x7f800000;
                    auVar168._24_4_ = 0x7f800000;
                    auVar168._28_4_ = 0x7f800000;
                    auVar121 = vblendmps_avx512vl(auVar168,local_800);
                    auVar144._0_4_ =
                         (uint)(bVar91 & 1) * auVar121._0_4_ |
                         (uint)!(bool)(bVar91 & 1) * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar92 >> 1) & 1);
                    auVar144._4_4_ = (uint)bVar14 * auVar121._4_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar92 >> 2) & 1);
                    auVar144._8_4_ = (uint)bVar14 * auVar121._8_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar92 >> 3) & 1);
                    auVar144._12_4_ = (uint)bVar14 * auVar121._12_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar92 >> 4) & 1);
                    auVar144._16_4_ = (uint)bVar14 * auVar121._16_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar92 >> 5) & 1);
                    auVar144._20_4_ = (uint)bVar14 * auVar121._20_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar92 >> 6) & 1);
                    auVar144._24_4_ = (uint)bVar14 * auVar121._24_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = SUB81(uVar92 >> 7,0);
                    auVar144._28_4_ = (uint)bVar14 * auVar121._28_4_ | (uint)!bVar14 * 0x7f800000;
                    auVar121 = vshufps_avx(auVar144,auVar144,0xb1);
                    auVar121 = vminps_avx(auVar144,auVar121);
                    auVar122 = vshufpd_avx(auVar121,auVar121,5);
                    auVar121 = vminps_avx(auVar121,auVar122);
                    auVar122 = vpermpd_avx2(auVar121,0x4e);
                    auVar121 = vminps_avx(auVar121,auVar122);
                    uVar178 = vcmpps_avx512vl(auVar144,auVar121,0);
                    uVar84 = (uint)uVar92;
                    if (((byte)uVar178 & bVar91) != 0) {
                      uVar84 = (uint)((byte)uVar178 & bVar91);
                    }
                    uVar85 = 0;
                    for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
                      uVar85 = uVar85 + 1;
                    }
                    uVar83 = (ulong)uVar85;
                    pGVar81 = pGVar88;
                    local_600 = local_800;
                    local_5dc = iVar8;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar88->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      do {
                        local_818 = pGVar81;
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_580[uVar83]));
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_560 + uVar83 * 4)))
                        ;
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_540 + uVar83 * 4);
                        local_848.context = context->user;
                        fVar177 = local_200._0_4_;
                        fVar229 = 1.0 - fVar177;
                        fVar185 = fVar229 * fVar229 * -3.0;
                        auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar229 * fVar229)),
                                                  ZEXT416((uint)(fVar177 * fVar229)),
                                                  ZEXT416(0xc0000000));
                        auVar96 = vfmsub132ss_fma(ZEXT416((uint)(fVar177 * fVar229)),
                                                  ZEXT416((uint)(fVar177 * fVar177)),
                                                  ZEXT416(0x40000000));
                        fVar229 = auVar95._0_4_ * 3.0;
                        fVar230 = auVar96._0_4_ * 3.0;
                        fVar177 = fVar177 * fVar177 * 3.0;
                        auVar220._0_4_ = fVar177 * fVar174;
                        auVar220._4_4_ = fVar177 * fVar175;
                        auVar220._8_4_ = fVar177 * fVar176;
                        auVar220._12_4_ = fVar177 * fVar80;
                        auVar161._4_4_ = fVar230;
                        auVar161._0_4_ = fVar230;
                        auVar161._8_4_ = fVar230;
                        auVar161._12_4_ = fVar230;
                        auVar95 = vfmadd132ps_fma(auVar161,auVar220,auVar102);
                        auVar203._4_4_ = fVar229;
                        auVar203._0_4_ = fVar229;
                        auVar203._8_4_ = fVar229;
                        auVar203._12_4_ = fVar229;
                        auVar95 = vfmadd132ps_fma(auVar203,auVar95,auVar101);
                        auVar162._4_4_ = fVar185;
                        auVar162._0_4_ = fVar185;
                        auVar162._8_4_ = fVar185;
                        auVar162._12_4_ = fVar185;
                        auVar95 = vfmadd132ps_fma(auVar162,auVar95,auVar28);
                        auVar246 = vbroadcastss_avx512f(auVar95);
                        auVar173 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar214 = vpermps_avx512f(auVar173,ZEXT1664(auVar95));
                        auVar222 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar222,ZEXT1664(auVar95));
                        local_2c0[0] = (RTCHitN)auVar246[0];
                        local_2c0[1] = (RTCHitN)auVar246[1];
                        local_2c0[2] = (RTCHitN)auVar246[2];
                        local_2c0[3] = (RTCHitN)auVar246[3];
                        local_2c0[4] = (RTCHitN)auVar246[4];
                        local_2c0[5] = (RTCHitN)auVar246[5];
                        local_2c0[6] = (RTCHitN)auVar246[6];
                        local_2c0[7] = (RTCHitN)auVar246[7];
                        local_2c0[8] = (RTCHitN)auVar246[8];
                        local_2c0[9] = (RTCHitN)auVar246[9];
                        local_2c0[10] = (RTCHitN)auVar246[10];
                        local_2c0[0xb] = (RTCHitN)auVar246[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar246[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar246[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar246[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar246[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar246[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar246[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar246[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar246[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar246[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar246[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar246[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar246[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar246[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar246[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar246[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar246[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar246[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar246[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar246[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar246[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar246[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar246[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar246[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar246[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar246[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar246[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar246[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar246[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar246[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar246[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar246[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar246[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar246[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar246[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar246[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar246[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar246[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar246[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar246[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar246[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar246[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar246[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar246[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar246[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar246[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar246[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar246[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar246[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar246[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar246[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar246[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar246[0x3f];
                        local_280 = auVar214;
                        local_180 = local_440._0_8_;
                        uStack_178 = local_440._8_8_;
                        uStack_170 = local_440._16_8_;
                        uStack_168 = local_440._24_8_;
                        uStack_160 = local_440._32_8_;
                        uStack_158 = local_440._40_8_;
                        uStack_150 = local_440._48_8_;
                        uStack_148 = local_440._56_8_;
                        auVar246 = vmovdqa64_avx512f(local_480);
                        local_140 = vmovdqa64_avx512f(auVar246);
                        auVar121 = vpcmpeqd_avx2(auVar246._0_32_,auVar246._0_32_);
                        local_810[3] = auVar121;
                        local_810[2] = auVar121;
                        local_810[1] = auVar121;
                        *local_810 = auVar121;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_848.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_848.context)->instPrimID[0]))
                        ;
                        auVar246 = vmovdqa64_avx512f(local_300);
                        local_780 = vmovdqa64_avx512f(auVar246);
                        local_848.valid = (int *)local_780;
                        local_848.geometryUserPtr = pGVar88->userPtr;
                        local_848.hit = local_2c0;
                        local_848.N = 0x10;
                        local_7e0 = auVar244._0_32_;
                        local_848.ray = (RTCRayN *)ray;
                        if (pGVar88->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar214 = ZEXT1664(auVar214._0_16_);
                          auVar222 = ZEXT1664(auVar222._0_16_);
                          (*pGVar88->intersectionFilterN)(&local_848);
                          auVar227 = ZEXT3264(local_800);
                          auVar244 = ZEXT3264(local_7e0);
                          auVar246 = vmovdqa64_avx512f(local_780);
                          pGVar88 = local_818;
                        }
                        uVar178 = vptestmd_avx512f(auVar246,auVar246);
                        if ((short)uVar178 == 0) {
LAB_01bf588f:
                          *(int *)(ray + k * 4 + 0x200) = auVar244._0_4_;
                        }
                        else {
                          p_Var13 = context->args->filter;
                          if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar88->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar214 = ZEXT1664(auVar214._0_16_);
                            auVar222 = ZEXT1664(auVar222._0_16_);
                            (*p_Var13)(&local_848);
                            auVar227 = ZEXT3264(local_800);
                            auVar244 = ZEXT3264(local_7e0);
                            auVar246 = vmovdqa64_avx512f(local_780);
                            pGVar88 = local_818;
                          }
                          uVar36 = vptestmd_avx512f(auVar246,auVar246);
                          if ((short)uVar36 == 0) goto LAB_01bf588f;
                          iVar1 = *(int *)(local_848.hit + 4);
                          iVar2 = *(int *)(local_848.hit + 8);
                          iVar66 = *(int *)(local_848.hit + 0xc);
                          iVar67 = *(int *)(local_848.hit + 0x10);
                          iVar68 = *(int *)(local_848.hit + 0x14);
                          iVar69 = *(int *)(local_848.hit + 0x18);
                          iVar70 = *(int *)(local_848.hit + 0x1c);
                          iVar71 = *(int *)(local_848.hit + 0x20);
                          iVar72 = *(int *)(local_848.hit + 0x24);
                          iVar73 = *(int *)(local_848.hit + 0x28);
                          iVar74 = *(int *)(local_848.hit + 0x2c);
                          iVar75 = *(int *)(local_848.hit + 0x30);
                          iVar76 = *(int *)(local_848.hit + 0x34);
                          iVar77 = *(int *)(local_848.hit + 0x38);
                          iVar78 = *(int *)(local_848.hit + 0x3c);
                          bVar91 = (byte)uVar36;
                          bVar14 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar20 = (bool)((byte)(uVar36 >> 7) & 1);
                          bVar82 = (byte)(uVar36 >> 8);
                          bVar21 = (bool)((byte)(uVar36 >> 9) & 1);
                          bVar22 = (bool)((byte)(uVar36 >> 10) & 1);
                          bVar23 = (bool)((byte)(uVar36 >> 0xb) & 1);
                          bVar24 = (bool)((byte)(uVar36 >> 0xc) & 1);
                          bVar25 = (bool)((byte)(uVar36 >> 0xd) & 1);
                          bVar26 = (bool)((byte)(uVar36 >> 0xe) & 1);
                          bVar27 = SUB81(uVar36 >> 0xf,0);
                          *(uint *)(local_848.ray + 0x300) =
                               (uint)(bVar91 & 1) * *(int *)local_848.hit |
                               (uint)!(bool)(bVar91 & 1) * *(int *)(local_848.ray + 0x300);
                          *(uint *)(local_848.ray + 0x304) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_848.ray + 0x304);
                          *(uint *)(local_848.ray + 0x308) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_848.ray + 0x308);
                          *(uint *)(local_848.ray + 0x30c) =
                               (uint)bVar16 * iVar66 |
                               (uint)!bVar16 * *(int *)(local_848.ray + 0x30c);
                          *(uint *)(local_848.ray + 0x310) =
                               (uint)bVar17 * iVar67 |
                               (uint)!bVar17 * *(int *)(local_848.ray + 0x310);
                          *(uint *)(local_848.ray + 0x314) =
                               (uint)bVar18 * iVar68 |
                               (uint)!bVar18 * *(int *)(local_848.ray + 0x314);
                          *(uint *)(local_848.ray + 0x318) =
                               (uint)bVar19 * iVar69 |
                               (uint)!bVar19 * *(int *)(local_848.ray + 0x318);
                          *(uint *)(local_848.ray + 0x31c) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_848.ray + 0x31c);
                          *(uint *)(local_848.ray + 800) =
                               (uint)(bVar82 & 1) * iVar71 |
                               (uint)!(bool)(bVar82 & 1) * *(int *)(local_848.ray + 800);
                          *(uint *)(local_848.ray + 0x324) =
                               (uint)bVar21 * iVar72 |
                               (uint)!bVar21 * *(int *)(local_848.ray + 0x324);
                          *(uint *)(local_848.ray + 0x328) =
                               (uint)bVar22 * iVar73 |
                               (uint)!bVar22 * *(int *)(local_848.ray + 0x328);
                          *(uint *)(local_848.ray + 0x32c) =
                               (uint)bVar23 * iVar74 |
                               (uint)!bVar23 * *(int *)(local_848.ray + 0x32c);
                          *(uint *)(local_848.ray + 0x330) =
                               (uint)bVar24 * iVar75 |
                               (uint)!bVar24 * *(int *)(local_848.ray + 0x330);
                          *(uint *)(local_848.ray + 0x334) =
                               (uint)bVar25 * iVar76 |
                               (uint)!bVar25 * *(int *)(local_848.ray + 0x334);
                          *(uint *)(local_848.ray + 0x338) =
                               (uint)bVar26 * iVar77 |
                               (uint)!bVar26 * *(int *)(local_848.ray + 0x338);
                          *(uint *)(local_848.ray + 0x33c) =
                               (uint)bVar27 * iVar78 |
                               (uint)!bVar27 * *(int *)(local_848.ray + 0x33c);
                          iVar1 = *(int *)(local_848.hit + 0x44);
                          iVar2 = *(int *)(local_848.hit + 0x48);
                          iVar66 = *(int *)(local_848.hit + 0x4c);
                          iVar67 = *(int *)(local_848.hit + 0x50);
                          iVar68 = *(int *)(local_848.hit + 0x54);
                          iVar69 = *(int *)(local_848.hit + 0x58);
                          iVar70 = *(int *)(local_848.hit + 0x5c);
                          iVar71 = *(int *)(local_848.hit + 0x60);
                          iVar72 = *(int *)(local_848.hit + 100);
                          iVar73 = *(int *)(local_848.hit + 0x68);
                          iVar74 = *(int *)(local_848.hit + 0x6c);
                          iVar75 = *(int *)(local_848.hit + 0x70);
                          iVar76 = *(int *)(local_848.hit + 0x74);
                          iVar77 = *(int *)(local_848.hit + 0x78);
                          iVar78 = *(int *)(local_848.hit + 0x7c);
                          bVar14 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar20 = (bool)((byte)(uVar36 >> 7) & 1);
                          bVar21 = (bool)((byte)(uVar36 >> 9) & 1);
                          bVar22 = (bool)((byte)(uVar36 >> 10) & 1);
                          bVar23 = (bool)((byte)(uVar36 >> 0xb) & 1);
                          bVar24 = (bool)((byte)(uVar36 >> 0xc) & 1);
                          bVar25 = (bool)((byte)(uVar36 >> 0xd) & 1);
                          bVar26 = (bool)((byte)(uVar36 >> 0xe) & 1);
                          bVar27 = SUB81(uVar36 >> 0xf,0);
                          *(uint *)(local_848.ray + 0x340) =
                               (uint)(bVar91 & 1) * *(int *)(local_848.hit + 0x40) |
                               (uint)!(bool)(bVar91 & 1) * *(int *)(local_848.ray + 0x340);
                          *(uint *)(local_848.ray + 0x344) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_848.ray + 0x344);
                          *(uint *)(local_848.ray + 0x348) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_848.ray + 0x348);
                          *(uint *)(local_848.ray + 0x34c) =
                               (uint)bVar16 * iVar66 |
                               (uint)!bVar16 * *(int *)(local_848.ray + 0x34c);
                          *(uint *)(local_848.ray + 0x350) =
                               (uint)bVar17 * iVar67 |
                               (uint)!bVar17 * *(int *)(local_848.ray + 0x350);
                          *(uint *)(local_848.ray + 0x354) =
                               (uint)bVar18 * iVar68 |
                               (uint)!bVar18 * *(int *)(local_848.ray + 0x354);
                          *(uint *)(local_848.ray + 0x358) =
                               (uint)bVar19 * iVar69 |
                               (uint)!bVar19 * *(int *)(local_848.ray + 0x358);
                          *(uint *)(local_848.ray + 0x35c) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_848.ray + 0x35c);
                          *(uint *)(local_848.ray + 0x360) =
                               (uint)(bVar82 & 1) * iVar71 |
                               (uint)!(bool)(bVar82 & 1) * *(int *)(local_848.ray + 0x360);
                          *(uint *)(local_848.ray + 0x364) =
                               (uint)bVar21 * iVar72 |
                               (uint)!bVar21 * *(int *)(local_848.ray + 0x364);
                          *(uint *)(local_848.ray + 0x368) =
                               (uint)bVar22 * iVar73 |
                               (uint)!bVar22 * *(int *)(local_848.ray + 0x368);
                          *(uint *)(local_848.ray + 0x36c) =
                               (uint)bVar23 * iVar74 |
                               (uint)!bVar23 * *(int *)(local_848.ray + 0x36c);
                          *(uint *)(local_848.ray + 0x370) =
                               (uint)bVar24 * iVar75 |
                               (uint)!bVar24 * *(int *)(local_848.ray + 0x370);
                          *(uint *)(local_848.ray + 0x374) =
                               (uint)bVar25 * iVar76 |
                               (uint)!bVar25 * *(int *)(local_848.ray + 0x374);
                          *(uint *)(local_848.ray + 0x378) =
                               (uint)bVar26 * iVar77 |
                               (uint)!bVar26 * *(int *)(local_848.ray + 0x378);
                          *(uint *)(local_848.ray + 0x37c) =
                               (uint)bVar27 * iVar78 |
                               (uint)!bVar27 * *(int *)(local_848.ray + 0x37c);
                          iVar1 = *(int *)(local_848.hit + 0x84);
                          iVar2 = *(int *)(local_848.hit + 0x88);
                          iVar66 = *(int *)(local_848.hit + 0x8c);
                          iVar67 = *(int *)(local_848.hit + 0x90);
                          iVar68 = *(int *)(local_848.hit + 0x94);
                          iVar69 = *(int *)(local_848.hit + 0x98);
                          iVar70 = *(int *)(local_848.hit + 0x9c);
                          iVar71 = *(int *)(local_848.hit + 0xa0);
                          iVar72 = *(int *)(local_848.hit + 0xa4);
                          iVar73 = *(int *)(local_848.hit + 0xa8);
                          iVar74 = *(int *)(local_848.hit + 0xac);
                          iVar75 = *(int *)(local_848.hit + 0xb0);
                          iVar76 = *(int *)(local_848.hit + 0xb4);
                          iVar77 = *(int *)(local_848.hit + 0xb8);
                          iVar78 = *(int *)(local_848.hit + 0xbc);
                          bVar14 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar20 = (bool)((byte)(uVar36 >> 7) & 1);
                          bVar21 = (bool)((byte)(uVar36 >> 9) & 1);
                          bVar22 = (bool)((byte)(uVar36 >> 10) & 1);
                          bVar23 = (bool)((byte)(uVar36 >> 0xb) & 1);
                          bVar24 = (bool)((byte)(uVar36 >> 0xc) & 1);
                          bVar25 = (bool)((byte)(uVar36 >> 0xd) & 1);
                          bVar26 = (bool)((byte)(uVar36 >> 0xe) & 1);
                          bVar27 = SUB81(uVar36 >> 0xf,0);
                          *(uint *)(local_848.ray + 0x380) =
                               (uint)(bVar91 & 1) * *(int *)(local_848.hit + 0x80) |
                               (uint)!(bool)(bVar91 & 1) * *(int *)(local_848.ray + 0x380);
                          *(uint *)(local_848.ray + 900) =
                               (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_848.ray + 900);
                          *(uint *)(local_848.ray + 0x388) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_848.ray + 0x388);
                          *(uint *)(local_848.ray + 0x38c) =
                               (uint)bVar16 * iVar66 |
                               (uint)!bVar16 * *(int *)(local_848.ray + 0x38c);
                          *(uint *)(local_848.ray + 0x390) =
                               (uint)bVar17 * iVar67 |
                               (uint)!bVar17 * *(int *)(local_848.ray + 0x390);
                          *(uint *)(local_848.ray + 0x394) =
                               (uint)bVar18 * iVar68 |
                               (uint)!bVar18 * *(int *)(local_848.ray + 0x394);
                          *(uint *)(local_848.ray + 0x398) =
                               (uint)bVar19 * iVar69 |
                               (uint)!bVar19 * *(int *)(local_848.ray + 0x398);
                          *(uint *)(local_848.ray + 0x39c) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_848.ray + 0x39c);
                          *(uint *)(local_848.ray + 0x3a0) =
                               (uint)(bVar82 & 1) * iVar71 |
                               (uint)!(bool)(bVar82 & 1) * *(int *)(local_848.ray + 0x3a0);
                          *(uint *)(local_848.ray + 0x3a4) =
                               (uint)bVar21 * iVar72 |
                               (uint)!bVar21 * *(int *)(local_848.ray + 0x3a4);
                          *(uint *)(local_848.ray + 0x3a8) =
                               (uint)bVar22 * iVar73 |
                               (uint)!bVar22 * *(int *)(local_848.ray + 0x3a8);
                          *(uint *)(local_848.ray + 0x3ac) =
                               (uint)bVar23 * iVar74 |
                               (uint)!bVar23 * *(int *)(local_848.ray + 0x3ac);
                          *(uint *)(local_848.ray + 0x3b0) =
                               (uint)bVar24 * iVar75 |
                               (uint)!bVar24 * *(int *)(local_848.ray + 0x3b0);
                          *(uint *)(local_848.ray + 0x3b4) =
                               (uint)bVar25 * iVar76 |
                               (uint)!bVar25 * *(int *)(local_848.ray + 0x3b4);
                          *(uint *)(local_848.ray + 0x3b8) =
                               (uint)bVar26 * iVar77 |
                               (uint)!bVar26 * *(int *)(local_848.ray + 0x3b8);
                          *(uint *)(local_848.ray + 0x3bc) =
                               (uint)bVar27 * iVar78 |
                               (uint)!bVar27 * *(int *)(local_848.ray + 0x3bc);
                          iVar1 = *(int *)(local_848.hit + 0xc4);
                          iVar2 = *(int *)(local_848.hit + 200);
                          iVar66 = *(int *)(local_848.hit + 0xcc);
                          iVar67 = *(int *)(local_848.hit + 0xd0);
                          iVar68 = *(int *)(local_848.hit + 0xd4);
                          iVar69 = *(int *)(local_848.hit + 0xd8);
                          iVar70 = *(int *)(local_848.hit + 0xdc);
                          iVar71 = *(int *)(local_848.hit + 0xe0);
                          iVar72 = *(int *)(local_848.hit + 0xe4);
                          iVar73 = *(int *)(local_848.hit + 0xe8);
                          iVar74 = *(int *)(local_848.hit + 0xec);
                          iVar75 = *(int *)(local_848.hit + 0xf0);
                          iVar76 = *(int *)(local_848.hit + 0xf4);
                          iVar77 = *(int *)(local_848.hit + 0xf8);
                          iVar78 = *(int *)(local_848.hit + 0xfc);
                          bVar14 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar20 = (bool)((byte)(uVar36 >> 7) & 1);
                          bVar21 = (bool)((byte)(uVar36 >> 9) & 1);
                          bVar22 = (bool)((byte)(uVar36 >> 10) & 1);
                          bVar23 = (bool)((byte)(uVar36 >> 0xb) & 1);
                          bVar24 = (bool)((byte)(uVar36 >> 0xc) & 1);
                          bVar25 = (bool)((byte)(uVar36 >> 0xd) & 1);
                          bVar26 = (bool)((byte)(uVar36 >> 0xe) & 1);
                          bVar27 = SUB81(uVar36 >> 0xf,0);
                          *(uint *)(local_848.ray + 0x3c0) =
                               (uint)(bVar91 & 1) * *(int *)(local_848.hit + 0xc0) |
                               (uint)!(bool)(bVar91 & 1) * *(int *)(local_848.ray + 0x3c0);
                          *(uint *)(local_848.ray + 0x3c4) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_848.ray + 0x3c4);
                          *(uint *)(local_848.ray + 0x3c8) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_848.ray + 0x3c8);
                          *(uint *)(local_848.ray + 0x3cc) =
                               (uint)bVar16 * iVar66 |
                               (uint)!bVar16 * *(int *)(local_848.ray + 0x3cc);
                          *(uint *)(local_848.ray + 0x3d0) =
                               (uint)bVar17 * iVar67 |
                               (uint)!bVar17 * *(int *)(local_848.ray + 0x3d0);
                          *(uint *)(local_848.ray + 0x3d4) =
                               (uint)bVar18 * iVar68 |
                               (uint)!bVar18 * *(int *)(local_848.ray + 0x3d4);
                          *(uint *)(local_848.ray + 0x3d8) =
                               (uint)bVar19 * iVar69 |
                               (uint)!bVar19 * *(int *)(local_848.ray + 0x3d8);
                          *(uint *)(local_848.ray + 0x3dc) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_848.ray + 0x3dc);
                          *(uint *)(local_848.ray + 0x3e0) =
                               (uint)(bVar82 & 1) * iVar71 |
                               (uint)!(bool)(bVar82 & 1) * *(int *)(local_848.ray + 0x3e0);
                          *(uint *)(local_848.ray + 0x3e4) =
                               (uint)bVar21 * iVar72 |
                               (uint)!bVar21 * *(int *)(local_848.ray + 0x3e4);
                          *(uint *)(local_848.ray + 1000) =
                               (uint)bVar22 * iVar73 |
                               (uint)!bVar22 * *(int *)(local_848.ray + 1000);
                          *(uint *)(local_848.ray + 0x3ec) =
                               (uint)bVar23 * iVar74 |
                               (uint)!bVar23 * *(int *)(local_848.ray + 0x3ec);
                          *(uint *)(local_848.ray + 0x3f0) =
                               (uint)bVar24 * iVar75 |
                               (uint)!bVar24 * *(int *)(local_848.ray + 0x3f0);
                          *(uint *)(local_848.ray + 0x3f4) =
                               (uint)bVar25 * iVar76 |
                               (uint)!bVar25 * *(int *)(local_848.ray + 0x3f4);
                          *(uint *)(local_848.ray + 0x3f8) =
                               (uint)bVar26 * iVar77 |
                               (uint)!bVar26 * *(int *)(local_848.ray + 0x3f8);
                          *(uint *)(local_848.ray + 0x3fc) =
                               (uint)bVar27 * iVar78 |
                               (uint)!bVar27 * *(int *)(local_848.ray + 0x3fc);
                          iVar1 = *(int *)(local_848.hit + 0x104);
                          iVar2 = *(int *)(local_848.hit + 0x108);
                          iVar66 = *(int *)(local_848.hit + 0x10c);
                          iVar67 = *(int *)(local_848.hit + 0x110);
                          iVar68 = *(int *)(local_848.hit + 0x114);
                          iVar69 = *(int *)(local_848.hit + 0x118);
                          iVar70 = *(int *)(local_848.hit + 0x11c);
                          iVar71 = *(int *)(local_848.hit + 0x120);
                          iVar72 = *(int *)(local_848.hit + 0x124);
                          iVar73 = *(int *)(local_848.hit + 0x128);
                          iVar74 = *(int *)(local_848.hit + 300);
                          iVar75 = *(int *)(local_848.hit + 0x130);
                          iVar76 = *(int *)(local_848.hit + 0x134);
                          iVar77 = *(int *)(local_848.hit + 0x138);
                          iVar78 = *(int *)(local_848.hit + 0x13c);
                          bVar14 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar16 = (bool)((byte)(uVar36 >> 3) & 1);
                          bVar17 = (bool)((byte)(uVar36 >> 4) & 1);
                          bVar18 = (bool)((byte)(uVar36 >> 5) & 1);
                          bVar19 = (bool)((byte)(uVar36 >> 6) & 1);
                          bVar20 = (bool)((byte)(uVar36 >> 7) & 1);
                          bVar21 = (bool)((byte)(uVar36 >> 9) & 1);
                          bVar22 = (bool)((byte)(uVar36 >> 10) & 1);
                          bVar23 = (bool)((byte)(uVar36 >> 0xb) & 1);
                          bVar24 = (bool)((byte)(uVar36 >> 0xc) & 1);
                          bVar25 = (bool)((byte)(uVar36 >> 0xd) & 1);
                          bVar26 = (bool)((byte)(uVar36 >> 0xe) & 1);
                          bVar27 = SUB81(uVar36 >> 0xf,0);
                          *(uint *)(local_848.ray + 0x400) =
                               (uint)(bVar91 & 1) * *(int *)(local_848.hit + 0x100) |
                               (uint)!(bool)(bVar91 & 1) * *(int *)(local_848.ray + 0x400);
                          *(uint *)(local_848.ray + 0x404) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_848.ray + 0x404);
                          *(uint *)(local_848.ray + 0x408) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_848.ray + 0x408);
                          *(uint *)(local_848.ray + 0x40c) =
                               (uint)bVar16 * iVar66 |
                               (uint)!bVar16 * *(int *)(local_848.ray + 0x40c);
                          *(uint *)(local_848.ray + 0x410) =
                               (uint)bVar17 * iVar67 |
                               (uint)!bVar17 * *(int *)(local_848.ray + 0x410);
                          *(uint *)(local_848.ray + 0x414) =
                               (uint)bVar18 * iVar68 |
                               (uint)!bVar18 * *(int *)(local_848.ray + 0x414);
                          *(uint *)(local_848.ray + 0x418) =
                               (uint)bVar19 * iVar69 |
                               (uint)!bVar19 * *(int *)(local_848.ray + 0x418);
                          *(uint *)(local_848.ray + 0x41c) =
                               (uint)bVar20 * iVar70 |
                               (uint)!bVar20 * *(int *)(local_848.ray + 0x41c);
                          *(uint *)(local_848.ray + 0x420) =
                               (uint)(bVar82 & 1) * iVar71 |
                               (uint)!(bool)(bVar82 & 1) * *(int *)(local_848.ray + 0x420);
                          *(uint *)(local_848.ray + 0x424) =
                               (uint)bVar21 * iVar72 |
                               (uint)!bVar21 * *(int *)(local_848.ray + 0x424);
                          *(uint *)(local_848.ray + 0x428) =
                               (uint)bVar22 * iVar73 |
                               (uint)!bVar22 * *(int *)(local_848.ray + 0x428);
                          *(uint *)(local_848.ray + 0x42c) =
                               (uint)bVar23 * iVar74 |
                               (uint)!bVar23 * *(int *)(local_848.ray + 0x42c);
                          *(uint *)(local_848.ray + 0x430) =
                               (uint)bVar24 * iVar75 |
                               (uint)!bVar24 * *(int *)(local_848.ray + 0x430);
                          *(uint *)(local_848.ray + 0x434) =
                               (uint)bVar25 * iVar76 |
                               (uint)!bVar25 * *(int *)(local_848.ray + 0x434);
                          *(uint *)(local_848.ray + 0x438) =
                               (uint)bVar26 * iVar77 |
                               (uint)!bVar26 * *(int *)(local_848.ray + 0x438);
                          *(uint *)(local_848.ray + 0x43c) =
                               (uint)bVar27 * iVar78 |
                               (uint)!bVar27 * *(int *)(local_848.ray + 0x43c);
                          auVar246 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x140)
                                                      );
                          auVar246 = vmovdqu32_avx512f(auVar246);
                          *(undefined1 (*) [64])(local_848.ray + 0x440) = auVar246;
                          auVar246 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x180)
                                                      );
                          auVar246 = vmovdqu32_avx512f(auVar246);
                          *(undefined1 (*) [64])(local_848.ray + 0x480) = auVar246;
                          auVar246 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x1c0)
                                                      );
                          auVar246 = vmovdqa32_avx512f(auVar246);
                          *(undefined1 (*) [64])(local_848.ray + 0x4c0) = auVar246;
                          auVar246 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_848.hit + 0x200)
                                                      );
                          auVar246 = vmovdqa32_avx512f(auVar246);
                          *(undefined1 (*) [64])(local_848.ray + 0x500) = auVar246;
                          auVar244 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
                        }
                        bVar91 = ~(byte)(1 << ((uint)uVar83 & 0x1f)) & (byte)uVar92;
                        uVar157 = auVar244._0_4_;
                        auVar169._4_4_ = uVar157;
                        auVar169._0_4_ = uVar157;
                        auVar169._8_4_ = uVar157;
                        auVar169._12_4_ = uVar157;
                        auVar169._16_4_ = uVar157;
                        auVar169._20_4_ = uVar157;
                        auVar169._24_4_ = uVar157;
                        auVar169._28_4_ = uVar157;
                        uVar178 = vcmpps_avx512vl(auVar227._0_32_,auVar169,2);
                        if ((bVar91 & (byte)uVar178) == 0) goto LAB_01bf5928;
                        bVar91 = bVar91 & (byte)uVar178;
                        uVar92 = (ulong)bVar91;
                        auVar170._8_4_ = 0x7f800000;
                        auVar170._0_8_ = 0x7f8000007f800000;
                        auVar170._12_4_ = 0x7f800000;
                        auVar170._16_4_ = 0x7f800000;
                        auVar170._20_4_ = 0x7f800000;
                        auVar170._24_4_ = 0x7f800000;
                        auVar170._28_4_ = 0x7f800000;
                        auVar121 = vblendmps_avx512vl(auVar170,auVar227._0_32_);
                        auVar145._0_4_ =
                             (uint)(bVar91 & 1) * auVar121._0_4_ |
                             (uint)!(bool)(bVar91 & 1) * 0x7f800000;
                        bVar14 = (bool)(bVar91 >> 1 & 1);
                        auVar145._4_4_ = (uint)bVar14 * auVar121._4_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar91 >> 2 & 1);
                        auVar145._8_4_ = (uint)bVar14 * auVar121._8_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar91 >> 3 & 1);
                        auVar145._12_4_ =
                             (uint)bVar14 * auVar121._12_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar91 >> 4 & 1);
                        auVar145._16_4_ =
                             (uint)bVar14 * auVar121._16_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar91 >> 5 & 1);
                        auVar145._20_4_ =
                             (uint)bVar14 * auVar121._20_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar91 >> 6 & 1);
                        auVar145._24_4_ =
                             (uint)bVar14 * auVar121._24_4_ | (uint)!bVar14 * 0x7f800000;
                        auVar145._28_4_ =
                             (uint)(bVar91 >> 7) * auVar121._28_4_ |
                             (uint)!(bool)(bVar91 >> 7) * 0x7f800000;
                        auVar121 = vshufps_avx(auVar145,auVar145,0xb1);
                        auVar121 = vminps_avx(auVar145,auVar121);
                        auVar122 = vshufpd_avx(auVar121,auVar121,5);
                        auVar121 = vminps_avx(auVar121,auVar122);
                        auVar122 = vpermpd_avx2(auVar121,0x4e);
                        auVar121 = vminps_avx(auVar121,auVar122);
                        uVar178 = vcmpps_avx512vl(auVar145,auVar121,0);
                        bVar82 = (byte)uVar178 & bVar91;
                        if (bVar82 != 0) {
                          bVar91 = bVar82;
                        }
                        uVar84 = 0;
                        for (uVar85 = (uint)bVar91; (uVar85 & 1) == 0;
                            uVar85 = uVar85 >> 1 | 0x80000000) {
                          uVar84 = uVar84 + 1;
                        }
                        uVar83 = (ulong)uVar84;
                        pGVar81 = local_818;
                      } while( true );
                    }
                    fVar185 = local_580[uVar83];
                    uVar157 = *(undefined4 *)(local_560 + uVar83 * 4);
                    fVar230 = 1.0 - fVar185;
                    fVar229 = fVar230 * fVar230 * -3.0;
                    auVar214 = ZEXT464((uint)fVar229);
                    auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar230 * fVar230)),
                                              ZEXT416((uint)(fVar185 * fVar230)),ZEXT416(0xc0000000)
                                             );
                    auVar96 = vfmsub132ss_fma(ZEXT416((uint)(fVar185 * fVar230)),
                                              ZEXT416((uint)(fVar185 * fVar185)),ZEXT416(0x40000000)
                                             );
                    fVar230 = auVar95._0_4_ * 3.0;
                    fVar177 = auVar96._0_4_ * 3.0;
                    fVar184 = fVar185 * fVar185 * 3.0;
                    auVar219._0_4_ = fVar184 * fVar174;
                    auVar219._4_4_ = fVar184 * fVar175;
                    auVar219._8_4_ = fVar184 * fVar176;
                    auVar219._12_4_ = fVar184 * fVar80;
                    auVar222 = ZEXT1664(auVar219);
                    auVar193._4_4_ = fVar177;
                    auVar193._0_4_ = fVar177;
                    auVar193._8_4_ = fVar177;
                    auVar193._12_4_ = fVar177;
                    auVar95 = vfmadd132ps_fma(auVar193,auVar219,auVar102);
                    auVar202._4_4_ = fVar230;
                    auVar202._0_4_ = fVar230;
                    auVar202._8_4_ = fVar230;
                    auVar202._12_4_ = fVar230;
                    auVar95 = vfmadd132ps_fma(auVar202,auVar95,auVar101);
                    auVar194._4_4_ = fVar229;
                    auVar194._0_4_ = fVar229;
                    auVar194._8_4_ = fVar229;
                    auVar194._12_4_ = fVar229;
                    auVar95 = vfmadd132ps_fma(auVar194,auVar95,auVar28);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_540 + uVar83 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar95._0_4_;
                    uVar9 = vextractps_avx(auVar95,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar9;
                    uVar9 = vextractps_avx(auVar95,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar9;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar185;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar157;
                    *(uint *)(ray + k * 4 + 0x440) = uVar7;
                    *(uint *)(ray + k * 4 + 0x480) = uVar89;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01bf555e;
      }
LAB_01bf4bf6:
      uVar157 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar38._4_4_ = uVar157;
      auVar38._0_4_ = uVar157;
      auVar38._8_4_ = uVar157;
      auVar38._12_4_ = uVar157;
      uVar178 = vcmpps_avx512vl(local_510,auVar38,2);
      uVar89 = (uint)uVar90 & (uint)uVar90 + 0xf & (uint)uVar178;
      uVar90 = (ulong)uVar89;
    } while (uVar89 != 0);
  }
  return;
LAB_01bf5928:
  auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar246 = ZEXT1664(auVar95);
  auVar247 = ZEXT464(0xbf800000);
  auVar95 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
  auVar173 = ZEXT1664(auVar95);
LAB_01bf555e:
  lVar87 = lVar87 + 8;
  if (iVar8 <= (int)lVar87) goto LAB_01bf4bf6;
  goto LAB_01bf4ca3;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }